

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall
embree::SceneGraphFlattener::convertInstances
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node,Transformations *spaces)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  float fVar7;
  float fVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  undefined1 auVar10 [16];
  bool bVar11;
  Node *pNVar12;
  size_t sVar13;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar14;
  long lVar15;
  undefined1 (*pauVar16) [16];
  size_t sVar17;
  Ref<embree::SceneGraph::Node> *pRVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  _Base_ptr p_Var60;
  byte bVar61;
  undefined4 uVar62;
  BBox1f this_00;
  long *plVar63;
  ostream *poVar64;
  _Base_ptr p_Var65;
  undefined8 uVar66;
  ulong uVar67;
  runtime_error *prVar68;
  byte bVar70;
  undefined8 extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  ulong extraout_RDX_15;
  ulong extraout_RDX_16;
  ulong extraout_RDX_17;
  ulong extraout_RDX_18;
  ulong extraout_RDX_19;
  ulong extraout_RDX_20;
  ulong extraout_RDX_21;
  ulong extraout_RDX_22;
  size_t i_3;
  Ref<embree::SceneGraph::Node> *node_00;
  size_t i;
  ulong uVar71;
  ulong uVar72;
  _Base_ptr p_Var73;
  long lVar74;
  uint uVar75;
  int iVar76;
  uint uVar77;
  int iVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined4 uVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar139 [16];
  float local_178;
  float local_168;
  float fStack_164;
  undefined1 local_158 [16];
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> local_148;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  float fStack_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
  *local_70;
  SceneGraphFlattener *local_68;
  Node *local_60;
  undefined1 local_58 [16];
  pointer local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  undefined7 uVar69;
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  
  pNVar12 = node->ptr;
  local_70 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
              *)group;
  local_68 = this;
  if (pNVar12->closed == true) {
    this_00 = (BBox1f)SceneGraph::TransformNode::operator_new(0xa0);
    local_60 = node->ptr;
    if (local_60 != (Node *)0x0) {
      (*(local_60->super_RefCount)._vptr_RefCount[2])();
    }
    lookupGeometries((SceneGraphFlattener *)local_58,&local_68->node);
    SceneGraph::TransformNode::TransformNode
              ((TransformNode *)this_00,spaces,(Ref<embree::SceneGraph::Node> *)local_58);
    local_158._0_8_ = this_00;
    (**(code **)(*(long *)this_00 + 0x10))(this_00);
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
    ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
              (local_70,(Ref<embree::SceneGraph::Node> *)local_158);
    if ((BBox1f)local_158._0_8_ != (BBox1f)0x0) {
      (**(code **)(*(long *)local_158._0_8_ + 0x18))();
    }
    if ((Node *)local_58._0_8_ != (Node *)0x0) {
      (*((RefCount *)local_58._0_8_)->_vptr_RefCount[3])();
    }
    if (local_60 != (Node *)0x0) {
      (*(local_60->super_RefCount)._vptr_RefCount[3])();
    }
  }
  else {
    plVar63 = (long *)__dynamic_cast(pNVar12,&SceneGraph::Node::typeinfo,
                                     &SceneGraph::TransformNode::typeinfo,0);
    if (plVar63 == (long *)0x0) {
      p_Var65 = (_Base_ptr)
                __dynamic_cast(pNVar12,&SceneGraph::Node::typeinfo,
                               &SceneGraph::MultiTransformNode::typeinfo,0);
      if (p_Var65 == (_Base_ptr)0x0) {
        plVar63 = (long *)__dynamic_cast(pNVar12,&SceneGraph::Node::typeinfo,
                                         &SceneGraph::GroupNode::typeinfo,0);
        if (plVar63 != (long *)0x0) {
          (**(code **)(*plVar63 + 0x10))(plVar63);
          pRVar18 = (Ref<embree::SceneGraph::Node> *)plVar63[0xe];
          for (node_00 = (Ref<embree::SceneGraph::Node> *)plVar63[0xd]; node_00 != pRVar18;
              node_00 = node_00 + 1) {
            convertInstances(local_68,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                       *)local_70,node_00,spaces);
          }
          (**(code **)(*plVar63 + 0x18))(plVar63);
        }
      }
      else {
        (**(code **)(*(long *)p_Var65 + 0x10))(p_Var65);
        local_58._0_8_ = (Node *)0x0;
        local_58._8_8_ = (pointer)0x0;
        local_48 = (pointer)0x0;
        p_Var73 = (_Base_ptr)0x0;
        local_40 = p_Var65;
        while( true ) {
          p_Var60 = local_40;
          p_Var65 = local_40[3]._M_parent;
          lVar74 = (long)local_40[3]._M_left - (long)p_Var65;
          uVar71 = lVar74 % 0x30;
          if ((_Base_ptr)(lVar74 / 0x30) <= p_Var73) break;
          puVar5 = (undefined8 *)((long)p_Var65 + (long)p_Var73 * 0x30);
          sVar13 = *(size_t *)((long)p_Var65 + (long)p_Var73 * 0x30 + 0x10);
          local_38 = p_Var73;
          if (sVar13 == 1) {
            fVar79 = (float)*puVar5;
            fVar81 = (float)((ulong)*puVar5 >> 0x20);
            fVar100 = (spaces->time_range).lower;
            fVar80 = (spaces->time_range).upper;
            uVar75 = -(uint)(fVar79 < fVar100);
            uVar77 = -(uint)(fVar81 < fVar80);
            local_158._0_8_ =
                 CONCAT44(~uVar77 & (uint)fVar80,~uVar75 & (uint)fVar79) |
                 CONCAT44((uint)fVar81 & uVar77,(uint)fVar100 & uVar75);
            sVar13 = (spaces->spaces).size_active;
            uVar66 = &local_148;
            local_148.l.vy.field_0._0_8_ =
                 (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            local_148.l.vx.field_0._0_8_ = 0;
            local_148.l.vx.field_0._8_8_ = 0;
            if (sVar13 != 0) {
              uVar66 = alignedMalloc(sVar13 << 6,0x10);
              uVar71 = extraout_RDX_03;
              local_148.l.vx.field_0._8_8_ = sVar13;
              local_148.l.vy.field_0._0_8_ = uVar66;
            }
            local_148.l.vy.field_0._8_1_ = 0;
            lVar74 = 0x30;
            local_148.l.vx.field_0._0_8_ = local_148.l.vx.field_0._8_8_;
            for (uVar72 = 0; uVar75 = (uint)uVar71, uVar72 < (spaces->spaces).size_active;
                uVar72 = uVar72 + 1) {
              pauVar16 = (undefined1 (*) [16])puVar5[4];
              pAVar14 = (spaces->spaces).items;
              bVar61 = *(byte *)(puVar5 + 5);
              uVar69 = (undefined7)((ulong)uVar66 >> 8);
              uVar67 = CONCAT71(uVar69,bVar61);
              bVar11 = spaces->quaternion;
              local_148.l.vy.field_0._8_1_ = 0;
              fVar79 = (float)((ulong)*(undefined8 *)(*pauVar16 + 4) >> 0x20);
              local_178 = (float)*(undefined8 *)(*pauVar16 + 4);
              if (((((*(float *)*pauVar16 != 1.0) || (NAN(*(float *)*pauVar16))) ||
                   (local_178 != 0.0)) || ((NAN(local_178) || (fVar79 != 0.0)))) || (NAN(fVar79))) {
LAB_00151d75:
                uVar66 = *(undefined8 *)((long)pAVar14 + lVar74 + -0x30);
                fVar100 = (float)uVar66;
                fVar122 = (float)((ulong)uVar66 >> 0x20);
                iVar76 = -(uint)(fVar100 != 1.0);
                iVar78 = -(uint)(fVar122 != 0.0);
                auVar85._4_4_ = iVar78;
                auVar85._0_4_ = iVar76;
                auVar85._8_4_ = iVar78;
                auVar85._12_4_ = iVar78;
                auVar84._8_8_ = auVar85._8_8_;
                auVar84._4_4_ = iVar76;
                auVar84._0_4_ = iVar76;
                uVar75 = movmskpd(uVar75,auVar84);
                fVar81 = *(float *)((long)pAVar14 + lVar74 + -0x28);
                if (((((uVar75 & 1) == 0) && (bVar70 = (byte)uVar75 >> 1, bVar70 == 0)) &&
                    (fVar81 == 0.0)) && (!NAN(fVar81))) {
                  pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x24);
                  auVar51._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar51._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar51._8_4_ = -(uint)(pfVar1[2] != 1.0);
                  auVar51._12_4_ = -(uint)(pfVar1[3] != 0.0);
                  uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar51);
                  if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                     (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                    pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x14);
                    auVar52._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar52._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar52._8_4_ = -(uint)(pfVar1[2] != 0.0);
                    auVar52._12_4_ = -(uint)(pfVar1[3] != 1.0);
                    uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar52);
                    if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                       (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                      pfVar1 = (float *)((long)pAVar14 + lVar74 + -4);
                      auVar53._4_4_ = -(uint)(pfVar1[1] != 0.0);
                      auVar53._0_4_ = -(uint)(*pfVar1 != 0.0);
                      auVar53._8_4_ = -(uint)(pfVar1[2] != 0.0);
                      auVar53._12_4_ = -(uint)(pfVar1[3] != 0.0);
                      uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar53);
                      if ((((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                           ((uVar75 & 4) == 0)) &&
                          (bVar70 = ((byte)uVar75 & 8) >> 3,
                          uVar71 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 == 0)) &&
                         ((bVar11 == false ||
                          ((fVar80 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 0xc),
                           fVar80 == 1.0 && (!NAN(fVar80))))))) {
                        fVar80 = *(float *)*pauVar16;
                        local_178 = *(float *)(*pauVar16 + 4);
                        fVar79 = *(float *)(*pauVar16 + 8);
                        fVar122 = *(float *)(*pauVar16 + 0xc);
                        uVar62 = *(undefined4 *)pauVar16[1];
                        uVar117 = *(undefined4 *)(pauVar16[1] + 4);
                        fVar127 = *(float *)(pauVar16[1] + 8);
                        fVar110 = *(float *)(pauVar16[1] + 0xc);
                        fVar81 = *(float *)pauVar16[2];
                        fVar100 = *(float *)(pauVar16[2] + 4);
                        fVar101 = *(float *)(pauVar16[2] + 8);
                        fVar104 = *(float *)(pauVar16[2] + 0xc);
                        fVar94 = *(float *)pauVar16[3];
                        fVar106 = *(float *)(pauVar16[3] + 4);
                        fVar112 = *(float *)(pauVar16[3] + 8);
                        fVar105 = *(float *)(pauVar16[3] + 0xc);
                        local_148.l.vy.field_0._8_1_ = bVar61;
                        goto LAB_00152495;
                      }
                    }
                  }
                }
                uVar71 = uVar67 & 0xffffffff;
                bVar70 = (byte)uVar71 | bVar11;
                uVar71 = CONCAT71((int7)(uVar71 >> 8),bVar70);
                if (bVar70 == 0) {
                  fVar112 = *(float *)*pauVar16;
                  fVar125 = *(float *)(*pauVar16 + 4);
                  fVar126 = *(float *)(*pauVar16 + 8);
                  fVar128 = *(float *)(*pauVar16 + 0xc);
                  fVar134 = *(float *)pauVar16[1];
                  fVar137 = *(float *)(pauVar16[1] + 4);
                  fVar95 = *(float *)(pauVar16[1] + 8);
                  fVar96 = *(float *)(pauVar16[1] + 0xc);
                  fVar97 = *(float *)pauVar16[2];
                  fVar130 = *(float *)(pauVar16[2] + 4);
                  fVar98 = *(float *)(pauVar16[2] + 8);
                  fVar99 = *(float *)(pauVar16[2] + 0xc);
                  fVar80 = fVar100 * fVar112 + fVar122 * fVar134 + fVar81 * fVar97;
                  local_178 = fVar100 * fVar125 + fVar122 * fVar137 + fVar81 * fVar130;
                  fVar79 = fVar100 * fVar126 + fVar122 * fVar95 + fVar81 * fVar98;
                  fVar122 = fVar100 * fVar128 + fVar122 * fVar96 + fVar81 * fVar99;
                  fVar81 = *(float *)((long)pAVar14 + lVar74 + -0x20);
                  fVar100 = *(float *)((long)pAVar14 + lVar74 + -0x1c);
                  fVar110 = *(float *)((long)pAVar14 + lVar74 + -0x18);
                  fVar104 = *(float *)((long)pAVar14 + lVar74 + -0x10);
                  uVar62 = fVar81 * fVar112 + fVar100 * fVar134 + fVar110 * fVar97;
                  uVar117 = fVar81 * fVar125 + fVar100 * fVar137 + fVar110 * fVar130;
                  fVar127 = fVar81 * fVar126 + fVar100 * fVar95 + fVar110 * fVar98;
                  fVar110 = fVar81 * fVar128 + fVar100 * fVar96 + fVar110 * fVar99;
                  fVar94 = *(float *)((long)pAVar14 + lVar74 + -0xc);
                  fVar106 = *(float *)((long)pAVar14 + lVar74 + -8);
                  fVar81 = fVar104 * fVar112 + fVar94 * fVar134 + fVar106 * fVar97;
                  fVar100 = fVar104 * fVar125 + fVar94 * fVar137 + fVar106 * fVar130;
                  fVar101 = fVar104 * fVar126 + fVar94 * fVar95 + fVar106 * fVar98;
                  fVar104 = fVar104 * fVar128 + fVar94 * fVar96 + fVar106 * fVar99;
                  fVar105 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                  fVar7 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 4);
                  fVar8 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 8);
                  fVar94 = fVar105 * fVar112 + fVar7 * fVar134 + fVar8 * fVar97 +
                           *(float *)pauVar16[3];
                  fVar106 = fVar105 * fVar125 + fVar7 * fVar137 + fVar8 * fVar130 +
                            *(float *)(pauVar16[3] + 4);
                  fVar112 = fVar105 * fVar126 + fVar7 * fVar95 + fVar8 * fVar98 +
                            *(float *)(pauVar16[3] + 8);
                  fVar105 = fVar105 * fVar128 + fVar7 * fVar96 + fVar8 * fVar99 +
                            *(float *)(pauVar16[3] + 0xc);
                }
                else {
                  uVar67 = uVar67 & 0xffffffff;
                  bVar70 = (byte)uVar67 & bVar11;
                  uVar71 = CONCAT71((int7)(uVar67 >> 8),bVar70);
                  if (bVar70 == 1) {
                    poVar64 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar64);
                    fVar79 = *(float *)(pauVar16[3] + 0xc);
                    fVar81 = *(float *)(*pauVar16 + 0xc);
                    fVar100 = *(float *)(pauVar16[1] + 0xc);
                    fVar80 = *(float *)(pauVar16[2] + 0xc);
                    auVar10 = *pauVar16;
                    fVar122 = *(float *)pauVar16[1];
                    fVar127 = *(float *)(pauVar16[1] + 4);
                    fVar110 = *(float *)pauVar16[2];
                    fVar101 = *(float *)(pauVar16[2] + 4);
                    fVar104 = *(float *)(pauVar16[2] + 8);
                    fVar128 = fVar81 * fVar100 + fVar79 * fVar80;
                    fVar106 = fVar81 * fVar100 - fVar79 * fVar80;
                    fVar112 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar100 * fVar100 +
                              -fVar80 * fVar80;
                    fVar125 = fVar79 * fVar79 - fVar81 * fVar81;
                    fVar126 = fVar100 * fVar100 + fVar125 + -fVar80 * fVar80;
                    fVar137 = fVar81 * fVar80 - fVar79 * fVar100;
                    fVar94 = fVar79 * fVar100 + fVar81 * fVar80;
                    fVar134 = fVar100 * fVar80 + fVar79 * fVar81;
                    fVar79 = fVar100 * fVar80 - fVar79 * fVar81;
                    fVar105 = *(float *)pauVar16[3];
                    fVar7 = *(float *)(pauVar16[3] + 4);
                    fVar8 = *(float *)(pauVar16[3] + 8);
                    fVar128 = fVar128 + fVar128;
                    fVar137 = fVar137 + fVar137;
                    fVar106 = fVar106 + fVar106;
                    fVar134 = fVar134 + fVar134;
                    fVar94 = fVar94 + fVar94;
                    fVar79 = fVar79 + fVar79;
                    fVar81 = fVar80 * fVar80 + fVar125 + -fVar100 * fVar100;
                    fVar113 = fVar112 * 1.0 + fVar128 * 0.0 + fVar137 * 0.0;
                    fVar115 = fVar112 * 0.0 + fVar128 * 1.0 + fVar137 * 0.0;
                    fVar118 = fVar112 * 0.0 + fVar128 * 0.0 + fVar137 * 1.0;
                    fVar120 = fVar112 * 0.0 + fVar128 * 0.0 + fVar137 * 0.0;
                    fVar107 = fVar106 * 1.0 + fVar126 * 0.0 + fVar134 * 0.0;
                    fVar108 = fVar106 * 0.0 + fVar126 * 1.0 + fVar134 * 0.0;
                    fVar109 = fVar106 * 0.0 + fVar126 * 0.0 + fVar134 * 1.0;
                    fVar111 = fVar106 * 0.0 + fVar126 * 0.0 + fVar134 * 0.0;
                    fVar106 = fVar94 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                    fVar112 = fVar94 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                    fVar128 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                    fVar137 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                    local_168 = auVar10._4_4_;
                    fStack_164 = auVar10._8_4_;
                    local_178 = auVar10._0_4_;
                    fVar129 = local_178 * fVar113 + fVar107 * 0.0 + fVar106 * 0.0;
                    fVar131 = local_178 * fVar115 + fVar108 * 0.0 + fVar112 * 0.0;
                    fVar132 = local_178 * fVar118 + fVar109 * 0.0 + fVar128 * 0.0;
                    fVar133 = local_178 * fVar120 + fVar111 * 0.0 + fVar137 * 0.0;
                    fVar125 = fVar122 * fVar113 + fVar127 * fVar107 + fVar106 * 0.0;
                    fVar126 = fVar122 * fVar115 + fVar127 * fVar108 + fVar112 * 0.0;
                    fVar134 = fVar122 * fVar118 + fVar127 * fVar109 + fVar128 * 0.0;
                    fVar95 = fVar122 * fVar120 + fVar127 * fVar111 + fVar137 * 0.0;
                    local_148.l.vz.field_0.m128[0] =
                         fVar110 * fVar113 + fVar101 * fVar107 + fVar104 * fVar106;
                    local_148.l.vz.field_0.m128[1] =
                         fVar110 * fVar115 + fVar101 * fVar108 + fVar104 * fVar112;
                    local_148.l.vz.field_0.m128[2] =
                         fVar110 * fVar118 + fVar101 * fVar109 + fVar104 * fVar128;
                    local_148.l.vz.field_0.m128[3] =
                         fVar110 * fVar120 + fVar101 * fVar111 + fVar104 * fVar137;
                    fVar79 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 0xc);
                    fVar81 = *(float *)((long)pAVar14 + lVar74 + -0x24);
                    fVar100 = *(float *)((long)pAVar14 + lVar74 + -0x14);
                    fVar80 = *(float *)((long)pAVar14 + lVar74 + -4);
                    fVar130 = fVar81 * fVar100 + fVar79 * fVar80;
                    fVar96 = fVar81 * fVar100 - fVar79 * fVar80;
                    fVar97 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar100 * fVar100 +
                             -fVar80 * fVar80;
                    fVar127 = fVar79 * fVar79 - fVar81 * fVar81;
                    fVar136 = fVar100 * fVar100 + fVar127 + -fVar80 * fVar80;
                    fVar135 = fVar81 * fVar80 - fVar79 * fVar100;
                    fVar102 = fVar79 * fVar100 + fVar81 * fVar80;
                    fVar138 = fVar100 * fVar80 + fVar79 * fVar81;
                    fVar94 = fVar100 * fVar80 - fVar79 * fVar81;
                    pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x30);
                    fVar79 = *pfVar1;
                    pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x20);
                    fVar81 = *pfVar2;
                    fVar122 = pfVar2[1];
                    fVar121 = fVar80 * fVar80 + fVar127 + -fVar100 * fVar100;
                    pfVar3 = (float *)((long)pAVar14 + lVar74 + -0x10);
                    fVar100 = *pfVar3;
                    fVar80 = pfVar3[1];
                    fVar127 = pfVar3[2];
                    fVar130 = fVar130 + fVar130;
                    fVar135 = fVar135 + fVar135;
                    pfVar3 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                    fVar110 = *pfVar3;
                    fVar101 = pfVar3[1];
                    fVar104 = pfVar3[2];
                    fVar98 = fVar97 * 1.0 + fVar130 * 0.0 + fVar135 * 0.0;
                    fVar99 = fVar97 * 0.0 + fVar130 * 1.0 + fVar135 * 0.0;
                    fVar135 = fVar97 * 0.0 + fVar130 * 0.0 + fVar135 * 1.0;
                    fVar96 = fVar96 + fVar96;
                    fVar138 = fVar138 + fVar138;
                    fVar102 = fVar102 + fVar102;
                    fVar94 = fVar94 + fVar94;
                    fVar97 = fVar96 * 1.0 + fVar136 * 0.0 + fVar138 * 0.0;
                    fVar130 = fVar96 * 0.0 + fVar136 * 1.0 + fVar138 * 0.0;
                    fVar96 = fVar96 * 0.0 + fVar136 * 0.0 + fVar138 * 1.0;
                    fVar136 = fVar102 * 1.0 + fVar94 * 0.0 + fVar121 * 0.0;
                    fVar138 = fVar102 * 0.0 + fVar94 * 1.0 + fVar121 * 0.0;
                    fVar94 = fVar102 * 0.0 + fVar94 * 0.0 + fVar121 * 1.0;
                    fVar114 = fVar79 * fVar98 + fVar97 * 0.0 + fVar136 * 0.0;
                    fVar116 = fVar79 * fVar99 + fVar130 * 0.0 + fVar138 * 0.0;
                    fVar119 = fVar79 * fVar135 + fVar96 * 0.0 + fVar94 * 0.0;
                    fVar102 = fVar81 * fVar98 + fVar122 * fVar97 + fVar136 * 0.0;
                    fVar121 = fVar81 * fVar99 + fVar122 * fVar130 + fVar138 * 0.0;
                    fVar103 = fVar81 * fVar135 + fVar122 * fVar96 + fVar94 * 0.0;
                    fVar122 = fVar100 * fVar98 + fVar80 * fVar97 + fVar127 * fVar136;
                    fVar123 = fVar100 * fVar99 + fVar80 * fVar130 + fVar127 * fVar138;
                    fVar124 = fVar100 * fVar135 + fVar80 * fVar96 + fVar127 * fVar94;
                    fVar127 = fVar110 * fVar98 + fVar101 * fVar97 + fVar104 * fVar136 +
                              pfVar1[1] + 0.0;
                    fVar97 = fVar110 * fVar99 + fVar101 * fVar130 + fVar104 * fVar138 +
                             pfVar1[2] + 0.0;
                    fVar110 = fVar110 * fVar135 + fVar101 * fVar96 + fVar104 * fVar94 +
                              pfVar2[2] + 0.0;
                    fVar80 = fVar114 * fVar129 +
                             fVar116 * fVar125 + fVar119 * local_148.l.vz.field_0.m128[0];
                    local_178 = fVar114 * fVar131 +
                                fVar116 * fVar126 + fVar119 * local_148.l.vz.field_0.m128[1];
                    fVar79 = fVar114 * fVar132 +
                             fVar116 * fVar134 + fVar119 * local_148.l.vz.field_0.m128[2];
                    fVar81 = fVar122 * fVar129 +
                             fVar123 * fVar125 + fVar124 * local_148.l.vz.field_0.m128[0];
                    fVar100 = fVar122 * fVar131 +
                              fVar123 * fVar126 + fVar124 * local_148.l.vz.field_0.m128[1];
                    fVar101 = fVar122 * fVar132 +
                              fVar123 * fVar134 + fVar124 * local_148.l.vz.field_0.m128[2];
                    uVar71 = extraout_RDX_04;
                    fVar104 = fVar122 * fVar133 +
                              fVar123 * fVar95 + fVar124 * local_148.l.vz.field_0.m128[3];
                    fVar122 = fVar114 * fVar133 +
                              fVar116 * fVar95 + fVar119 * local_148.l.vz.field_0.m128[3];
                    fVar94 = fVar127 * fVar129 +
                             fVar97 * fVar125 + fVar110 * local_148.l.vz.field_0.m128[0] +
                             fVar105 * fVar113 + fVar7 * fVar107 + fVar8 * fVar106 + local_168 + 0.0
                    ;
                    fVar106 = fVar127 * fVar131 +
                              fVar97 * fVar126 + fVar110 * local_148.l.vz.field_0.m128[1] +
                              fVar105 * fVar115 + fVar7 * fVar108 + fVar8 * fVar112 +
                              fStack_164 + 0.0;
                    fVar112 = fVar127 * fVar132 +
                              fVar97 * fVar134 + fVar110 * local_148.l.vz.field_0.m128[2] +
                              fVar105 * fVar118 + fVar7 * fVar109 + fVar8 * fVar128 +
                              *(float *)(pauVar16[1] + 8) + 0.0;
                    fVar105 = fVar127 * fVar133 +
                              fVar97 * fVar95 + fVar110 * local_148.l.vz.field_0.m128[3] +
                              fVar105 * fVar120 + fVar7 * fVar111 + fVar8 * fVar137 + 0.0;
                    uVar62 = fVar102 * fVar129 +
                             fVar121 * fVar125 + fVar103 * local_148.l.vz.field_0.m128[0];
                    uVar117 = fVar102 * fVar131 +
                              fVar121 * fVar126 + fVar103 * local_148.l.vz.field_0.m128[1];
                    fVar127 = fVar102 * fVar132 +
                              fVar121 * fVar134 + fVar103 * local_148.l.vz.field_0.m128[2];
                    fVar110 = fVar102 * fVar133 +
                              fVar121 * fVar95 + fVar103 * local_148.l.vz.field_0.m128[3];
                  }
                  else {
                    bVar61 = bVar61 ^ 1 | bVar11;
                    if (bVar61 == 0) {
                      local_d8 = ZEXT416(*(uint *)(pauVar16[3] + 0xc));
                      local_b8 = ZEXT416(*(uint *)(*pauVar16 + 0xc));
                      local_a8 = ZEXT416(*(uint *)(pauVar16[1] + 0xc));
                      local_e8 = ZEXT416(*(uint *)(pauVar16[2] + 0xc));
                      local_108 = *(float *)pauVar16[1];
                      fStack_104 = *(float *)(pauVar16[1] + 4);
                      fStack_c0 = *(float *)(pauVar16[1] + 8);
                      fStack_fc = *(float *)(pauVar16[1] + 0xc);
                      local_f8 = *(float *)pauVar16[2];
                      fStack_f4 = *(float *)(pauVar16[2] + 4);
                      fStack_f0 = *(float *)(pauVar16[2] + 8);
                      fStack_ec = *(float *)(pauVar16[2] + 0xc);
                      local_88 = *(float *)*pauVar16;
                      fStack_7c = *(float *)(*pauVar16 + 4);
                      pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x30);
                      fVar81 = *pfVar1;
                      fVar100 = pfVar1[1];
                      fVar122 = pfVar1[2];
                      pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x20);
                      fVar127 = *pfVar1;
                      fVar110 = pfVar1[1];
                      fVar101 = pfVar1[2];
                      puVar6 = (undefined8 *)((long)pAVar14 + lVar74 + -0x10);
                      local_148.p.field_0._0_8_ = *puVar6;
                      local_148.p.field_0._8_8_ = puVar6[1];
                      pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                      fVar104 = *pfVar1;
                      fVar94 = pfVar1[1];
                      fVar106 = pfVar1[2];
                      fVar80 = fVar81 * local_88 + fVar100 * local_108 + fVar122 * local_f8;
                      fVar112 = fVar81 * 0.0 + fVar100 * fStack_104 + fVar122 * fStack_f4;
                      fVar81 = fVar81 * 0.0 + fVar100 * 0.0 + fVar122 * fStack_f0;
                      local_148.l.vz.field_0.m128[0] =
                           fVar127 * local_88 + fVar110 * local_108 + fVar101 * local_f8;
                      local_148.l.vz.field_0.m128[1] =
                           fVar127 * 0.0 + fVar110 * fStack_104 + fVar101 * fStack_f4;
                      local_148.l.vz.field_0.m128[2] =
                           fVar127 * 0.0 + fVar110 * 0.0 + fVar101 * fStack_f0;
                      local_148.l.vz.field_0.m128[3] =
                           fVar127 * fStack_7c + fVar110 * fStack_fc + fVar101 * fStack_ec;
                      fStack_100 = 0.0;
                      fStack_84 = 0.0;
                      fStack_80 = 0.0;
                      local_98._0_4_ =
                           fVar104 * local_88 + fVar94 * local_108 + fVar106 * local_f8 +
                           *(float *)pauVar16[3];
                      local_98._4_4_ =
                           fVar104 * 0.0 + fVar94 * fStack_104 + fVar106 * fStack_f4 +
                           *(float *)(pauVar16[3] + 4);
                      fStack_90 = fVar104 * 0.0 + fVar94 * 0.0 + fVar106 * fStack_f0 +
                                  *(float *)(pauVar16[3] + 8);
                      register0x0000128c =
                           fVar104 * fStack_7c + fVar94 * fStack_fc + fVar106 * fStack_ec +
                           *(float *)(pauVar16[3] + 0xc);
                      local_c8 = local_108;
                      fStack_c4 = fStack_104;
                      fStack_bc = fStack_fc;
                      if (((fVar112 != 0.0) || (NAN(fVar112))) ||
                         ((fVar81 != 0.0 ||
                          (((NAN(fVar81) || (local_148.l.vz.field_0.m128[2] != 0.0)) ||
                           (NAN(local_148.l.vz.field_0.m128[2]))))))) {
                        poVar64 = std::operator<<((ostream *)&std::cout,
                                                  "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                                 );
                        std::endl<char,std::char_traits<char>>(poVar64);
                        uVar71 = extraout_RDX_06;
                      }
                      fVar81 = local_88 * local_148.p.field_0.m128[0] +
                               local_108 * local_148.p.field_0.m128[1] +
                               local_f8 * local_148.p.field_0.m128[2];
                      fVar100 = fStack_84 * local_148.p.field_0.m128[0] +
                                fStack_104 * local_148.p.field_0.m128[1] +
                                fStack_f4 * local_148.p.field_0.m128[2];
                      fVar101 = fStack_80 * local_148.p.field_0.m128[0] +
                                fStack_100 * local_148.p.field_0.m128[1] +
                                fStack_f0 * local_148.p.field_0.m128[2];
                      local_148.l.vy.field_0._8_1_ = 1;
                      fVar104 = (float)local_e8._0_4_;
                      fVar122 = (float)local_b8._0_4_;
                      fVar94 = (float)local_98._0_4_;
                      fVar106 = (float)local_98._4_4_;
                      fVar112 = fStack_90;
                      fVar105 = (float)local_d8._0_4_;
                      uVar62 = local_148.l.vz.field_0.m128[0];
                      uVar117 = local_148.l.vz.field_0.m128[1];
                      fVar127 = fStack_c0;
                      fVar110 = (float)local_a8._0_4_;
                    }
                    else {
                      if (((local_178 != 0.0) || (NAN(local_178))) ||
                         ((fVar79 != 0.0 ||
                          ((NAN(fVar79) ||
                           (auVar34._4_4_ = -(uint)(*(float *)pauVar16[1] != 0.0),
                           auVar34._0_4_ = -(uint)(*(float *)(pauVar16[1] + 8) != 0.0),
                           auVar34._8_4_ = -(uint)((float)*(undefined8 *)pauVar16[2] != 0.0),
                           auVar34._12_4_ =
                                -(uint)((float)((ulong)*(undefined8 *)pauVar16[2] >> 0x20) != 0.0),
                           uVar62 = movmskps((int)CONCAT71(uVar69,bVar61),auVar34),
                           (char)uVar62 != '\0')))))) {
                        poVar64 = std::operator<<((ostream *)&std::cout,
                                                  "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                                 );
                        std::endl<char,std::char_traits<char>>(poVar64);
                        uVar71 = extraout_RDX_05;
                      }
                      pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x30);
                      pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x20);
                      pfVar3 = (float *)((long)pAVar14 + lVar74 + -0x10);
                      fVar81 = *pfVar3;
                      fVar100 = pfVar3[1];
                      pfVar4 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                      fVar80 = *(float *)*pauVar16 * *pfVar1;
                      local_178 = pfVar1[1] + (float)*(undefined8 *)pauVar16[3];
                      fVar79 = pfVar1[2] + (float)((ulong)*(undefined8 *)pauVar16[3] >> 0x20);
                      fVar101 = pfVar3[2] * *(float *)(pauVar16[2] + 8);
                      local_148.l.vy.field_0._8_1_ = 1;
                      fVar104 = pfVar3[3];
                      fVar122 = pfVar1[3];
                      fVar94 = *pfVar4;
                      fVar106 = pfVar4[1];
                      fVar112 = pfVar4[2];
                      fVar105 = pfVar4[3];
                      uVar62 = *pfVar2;
                      uVar117 = pfVar2[1] * *(float *)(pauVar16[1] + 4);
                      fVar127 = pfVar2[2] + *(float *)(pauVar16[3] + 8);
                      fVar110 = pfVar2[3];
                    }
                  }
                }
              }
              else {
                auVar31._4_4_ = -(uint)(*(float *)pauVar16[1] != 0.0);
                auVar31._0_4_ = -(uint)(*(float *)(*pauVar16 + 0xc) != 0.0);
                auVar31._8_4_ = -(uint)(*(float *)(pauVar16[1] + 4) != 1.0);
                auVar31._12_4_ = -(uint)(*(float *)(pauVar16[1] + 8) != 0.0);
                uVar75 = movmskps(uVar75,auVar31);
                if ((((bVar61 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                   (((uVar75 & 4) != 0 ||
                    (bVar70 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70)
                    , bVar70 != 0)))) goto LAB_00151d75;
                auVar32._4_4_ = -(uint)(*(float *)pauVar16[2] != 0.0);
                auVar32._0_4_ = -(uint)(*(float *)(pauVar16[1] + 0xc) != 0.0);
                auVar32._8_4_ = -(uint)(*(float *)(pauVar16[2] + 4) != 0.0);
                auVar32._12_4_ = -(uint)(*(float *)(pauVar16[2] + 8) != 1.0);
                uVar75 = movmskps(uVar75,auVar32);
                if (((((bVar61 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0))
                   || (bVar70 = ((byte)uVar75 & 8) >> 3,
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 != 0))
                goto LAB_00151d75;
                auVar33._4_4_ = -(uint)(*(float *)pauVar16[3] != 0.0);
                auVar33._0_4_ = -(uint)(*(float *)(pauVar16[2] + 0xc) != 0.0);
                auVar33._8_4_ = -(uint)(*(float *)(pauVar16[3] + 4) != 0.0);
                auVar33._12_4_ = -(uint)(*(float *)(pauVar16[3] + 8) != 0.0);
                uVar75 = movmskps(uVar75,auVar33);
                if ((((bVar61 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0))
                goto LAB_00151d75;
                bVar70 = ((byte)uVar75 & 8) >> 3;
                uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
                uVar71 = (ulong)uVar75;
                if ((bVar70 != 0) ||
                   ((bVar61 != 0 &&
                    ((*(float *)(pauVar16[3] + 0xc) != 1.0 || (NAN(*(float *)(pauVar16[3] + 0xc)))))
                    ))) goto LAB_00151d75;
                pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x30);
                fVar80 = *pfVar1;
                local_178 = pfVar1[1];
                fVar79 = pfVar1[2];
                fVar122 = pfVar1[3];
                pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x20);
                uVar62 = *pfVar1;
                uVar117 = pfVar1[1];
                fVar127 = pfVar1[2];
                fVar110 = pfVar1[3];
                pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x10);
                fVar81 = *pfVar1;
                fVar100 = pfVar1[1];
                fVar101 = pfVar1[2];
                fVar104 = pfVar1[3];
                pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                fVar94 = *pfVar1;
                fVar106 = pfVar1[1];
                fVar112 = pfVar1[2];
                fVar105 = pfVar1[3];
                local_148.l.vy.field_0._8_1_ = bVar11;
              }
LAB_00152495:
              pfVar1 = (float *)((long)&((Vector *)(local_148.l.vy.field_0._0_8_ + -0x30))->field_0
                                + lVar74);
              *pfVar1 = fVar80;
              pfVar1[1] = local_178;
              pfVar1[2] = fVar79;
              pfVar1[3] = fVar122;
              pfVar1 = (float *)((long)&((Vector *)(local_148.l.vy.field_0._0_8_ + -0x20))->field_0
                                + lVar74);
              *pfVar1 = (float)uVar62;
              pfVar1[1] = (float)uVar117;
              pfVar1[2] = fVar127;
              pfVar1[3] = fVar110;
              pfVar1 = (float *)((long)&((Vector *)(local_148.l.vy.field_0._0_8_ + -0x10))->field_0
                                + lVar74);
              *pfVar1 = fVar81;
              pfVar1[1] = fVar100;
              pfVar1[2] = fVar101;
              pfVar1[3] = fVar104;
              pfVar1 = (float *)(local_148.l.vy.field_0._0_8_ + lVar74);
              *pfVar1 = fVar94;
              pfVar1[1] = fVar106;
              pfVar1[2] = fVar112;
              pfVar1[3] = fVar105;
              lVar74 = lVar74 + 0x40;
              uVar66 = local_148.l.vy.field_0._0_8_;
            }
          }
          else {
            sVar17 = (spaces->spaces).size_active;
            if (sVar17 == 1) {
              fVar79 = (float)*puVar5;
              fVar81 = (float)((ulong)*puVar5 >> 0x20);
              fVar100 = (spaces->time_range).lower;
              fVar80 = (spaces->time_range).upper;
              uVar75 = -(uint)(fVar79 < fVar100);
              uVar77 = -(uint)(fVar81 < fVar80);
              local_158._0_8_ =
                   CONCAT44(~uVar77 & (uint)fVar80,~uVar75 & (uint)fVar79) |
                   CONCAT44((uint)fVar81 & uVar77,(uint)fVar100 & uVar75);
              local_148.l.vy.field_0._0_8_ =
                   (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
              local_148.l.vx.field_0._0_8_ = 0;
              local_148.l.vx.field_0._8_8_ = 0;
              if (sVar13 != 0) {
                local_148.l.vy.field_0._0_8_ = alignedMalloc(sVar13 << 6,0x10);
                uVar71 = extraout_RDX_07;
                local_148.l.vx.field_0._8_8_ = sVar13;
              }
              uVar66 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
              if (*(char *)(puVar5 + 5) == '\0') {
                uVar66 = ZEXT48(*(uint *)&spaces->quaternion);
              }
              local_148.l.vy.field_0._8_1_ = (undefined1)uVar66;
              lVar74 = 0x30;
              local_148.l.vx.field_0._0_8_ = local_148.l.vx.field_0._8_8_;
              for (uVar72 = 0; uVar75 = (uint)uVar71, uVar72 < (ulong)puVar5[2]; uVar72 = uVar72 + 1
                  ) {
                lVar15 = puVar5[4];
                pAVar14 = (spaces->spaces).items;
                bVar61 = *(byte *)(puVar5 + 5);
                uVar69 = (undefined7)((ulong)uVar66 >> 8);
                uVar67 = CONCAT71(uVar69,bVar61);
                bVar11 = spaces->quaternion;
                local_148.l.vy.field_0._8_1_ = 0;
                fVar79 = *(float *)(lVar15 + -0x30 + lVar74);
                uVar66 = *(undefined8 *)(lVar15 + -0x2c + lVar74);
                fVar81 = (float)((ulong)uVar66 >> 0x20);
                local_178 = (float)uVar66;
                if ((((fVar79 != 1.0) || (NAN(fVar79))) || (local_178 != 0.0)) ||
                   (((NAN(local_178) || (fVar81 != 0.0)) || (NAN(fVar81))))) {
LAB_001529ac:
                  uVar66 = *(undefined8 *)&(pAVar14->l).vx.field_0;
                  fVar100 = (float)uVar66;
                  fVar122 = (float)((ulong)uVar66 >> 0x20);
                  iVar76 = -(uint)(fVar100 != 1.0);
                  iVar78 = -(uint)(fVar122 != 0.0);
                  auVar87._4_4_ = iVar78;
                  auVar87._0_4_ = iVar76;
                  auVar87._8_4_ = iVar78;
                  auVar87._12_4_ = iVar78;
                  auVar86._8_8_ = auVar87._8_8_;
                  auVar86._4_4_ = iVar76;
                  auVar86._0_4_ = iVar76;
                  uVar75 = movmskpd(uVar75,auVar86);
                  fVar79 = (pAVar14->l).vx.field_0.m128[2];
                  if (((((uVar75 & 1) == 0) && (bVar70 = (byte)uVar75 >> 1, bVar70 == 0)) &&
                      (fVar79 == 0.0)) && (!NAN(fVar79))) {
                    auVar54._4_4_ = -(uint)((pAVar14->l).vy.field_0.m128[0] != 0.0);
                    auVar54._0_4_ = -(uint)((pAVar14->l).vx.field_0.m128[3] != 0.0);
                    auVar54._8_4_ = -(uint)((pAVar14->l).vy.field_0.m128[1] != 1.0);
                    auVar54._12_4_ = -(uint)((pAVar14->l).vy.field_0.m128[2] != 0.0);
                    uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar54);
                    if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                       (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                      auVar55._4_4_ = -(uint)((pAVar14->l).vz.field_0.m128[0] != 0.0);
                      auVar55._0_4_ = -(uint)((pAVar14->l).vy.field_0.m128[3] != 0.0);
                      auVar55._8_4_ = -(uint)((pAVar14->l).vz.field_0.m128[1] != 0.0);
                      auVar55._12_4_ = -(uint)((pAVar14->l).vz.field_0.m128[2] != 1.0);
                      uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar55);
                      if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                         (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                        auVar56._4_4_ = -(uint)((pAVar14->p).field_0.m128[0] != 0.0);
                        auVar56._0_4_ = -(uint)((pAVar14->l).vz.field_0.m128[3] != 0.0);
                        auVar56._8_4_ = -(uint)((pAVar14->p).field_0.m128[1] != 0.0);
                        auVar56._12_4_ = -(uint)((pAVar14->p).field_0.m128[2] != 0.0);
                        uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar56);
                        if (((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                            ((uVar75 & 4) == 0)) &&
                           ((bVar70 = ((byte)uVar75 & 8) >> 3,
                            uVar71 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 == 0 &&
                            ((bVar11 == false ||
                             ((fVar80 = (pAVar14->p).field_0.m128[3], fVar80 == 1.0 &&
                              (!NAN(fVar80))))))))) {
                          pfVar1 = (float *)(lVar15 + -0x30 + lVar74);
                          fVar80 = *pfVar1;
                          local_178 = pfVar1[1];
                          fVar81 = pfVar1[2];
                          fVar122 = pfVar1[3];
                          pfVar1 = (float *)(lVar15 + -0x20 + lVar74);
                          uVar62 = *pfVar1;
                          uVar117 = pfVar1[1];
                          fVar127 = pfVar1[2];
                          fVar110 = pfVar1[3];
                          pfVar1 = (float *)(lVar15 + -0x10 + lVar74);
                          fVar79 = *pfVar1;
                          fVar100 = pfVar1[1];
                          fVar101 = pfVar1[2];
                          fVar104 = pfVar1[3];
                          pfVar1 = (float *)(lVar15 + lVar74);
                          fVar94 = *pfVar1;
                          fVar106 = pfVar1[1];
                          fVar112 = pfVar1[2];
                          fVar105 = pfVar1[3];
                          local_148.l.vy.field_0._8_1_ = bVar61;
                          goto LAB_001530ca;
                        }
                      }
                    }
                  }
                  uVar71 = uVar67 & 0xffffffff;
                  bVar70 = (byte)uVar71 | bVar11;
                  uVar71 = CONCAT71((int7)(uVar71 >> 8),bVar70);
                  if (bVar70 == 0) {
                    pfVar1 = (float *)(lVar15 + -0x30 + lVar74);
                    fVar112 = *pfVar1;
                    fVar125 = pfVar1[1];
                    fVar126 = pfVar1[2];
                    fVar128 = pfVar1[3];
                    pfVar1 = (float *)(lVar15 + -0x20 + lVar74);
                    fVar134 = *pfVar1;
                    fVar137 = pfVar1[1];
                    fVar95 = pfVar1[2];
                    fVar96 = pfVar1[3];
                    pfVar1 = (float *)(lVar15 + -0x10 + lVar74);
                    fVar97 = *pfVar1;
                    fVar130 = pfVar1[1];
                    fVar98 = pfVar1[2];
                    fVar99 = pfVar1[3];
                    fVar80 = fVar100 * fVar112 + fVar122 * fVar134 + fVar79 * fVar97;
                    local_178 = fVar100 * fVar125 + fVar122 * fVar137 + fVar79 * fVar130;
                    fVar81 = fVar100 * fVar126 + fVar122 * fVar95 + fVar79 * fVar98;
                    fVar122 = fVar100 * fVar128 + fVar122 * fVar96 + fVar79 * fVar99;
                    fVar79 = (pAVar14->l).vy.field_0.m128[0];
                    fVar100 = (pAVar14->l).vy.field_0.m128[1];
                    fVar110 = (pAVar14->l).vy.field_0.m128[2];
                    fVar104 = (pAVar14->l).vz.field_0.m128[0];
                    uVar62 = fVar79 * fVar112 + fVar100 * fVar134 + fVar110 * fVar97;
                    uVar117 = fVar79 * fVar125 + fVar100 * fVar137 + fVar110 * fVar130;
                    fVar127 = fVar79 * fVar126 + fVar100 * fVar95 + fVar110 * fVar98;
                    fVar110 = fVar79 * fVar128 + fVar100 * fVar96 + fVar110 * fVar99;
                    fVar94 = (pAVar14->l).vz.field_0.m128[1];
                    fVar106 = (pAVar14->l).vz.field_0.m128[2];
                    fVar79 = fVar104 * fVar112 + fVar94 * fVar134 + fVar106 * fVar97;
                    fVar100 = fVar104 * fVar125 + fVar94 * fVar137 + fVar106 * fVar130;
                    fVar101 = fVar104 * fVar126 + fVar94 * fVar95 + fVar106 * fVar98;
                    fVar104 = fVar104 * fVar128 + fVar94 * fVar96 + fVar106 * fVar99;
                    fVar105 = (pAVar14->p).field_0.m128[0];
                    fVar7 = (pAVar14->p).field_0.m128[1];
                    fVar8 = (pAVar14->p).field_0.m128[2];
                    pfVar1 = (float *)(lVar15 + lVar74);
                    fVar94 = fVar105 * fVar112 + fVar7 * fVar134 + fVar8 * fVar97 + *pfVar1;
                    fVar106 = fVar105 * fVar125 + fVar7 * fVar137 + fVar8 * fVar130 + pfVar1[1];
                    fVar112 = fVar105 * fVar126 + fVar7 * fVar95 + fVar8 * fVar98 + pfVar1[2];
                    fVar105 = fVar105 * fVar128 + fVar7 * fVar96 + fVar8 * fVar99 + pfVar1[3];
                  }
                  else {
                    uVar67 = uVar67 & 0xffffffff;
                    bVar70 = (byte)uVar67 & bVar11;
                    uVar71 = CONCAT71((int7)(uVar67 >> 8),bVar70);
                    if (bVar70 == 1) {
                      poVar64 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar64);
                      fVar79 = *(float *)(lVar15 + 0xc + lVar74);
                      fVar81 = *(float *)(lVar15 + -0x24 + lVar74);
                      fVar100 = *(float *)(lVar15 + -0x14 + lVar74);
                      fVar80 = *(float *)(lVar15 + -4 + lVar74);
                      auVar10 = *(undefined1 (*) [16])(lVar15 + -0x30 + lVar74);
                      pfVar1 = (float *)(lVar15 + -0x20 + lVar74);
                      fVar122 = *pfVar1;
                      fVar127 = pfVar1[1];
                      pfVar2 = (float *)(lVar15 + -0x10 + lVar74);
                      fVar110 = *pfVar2;
                      fVar101 = pfVar2[1];
                      fVar104 = pfVar2[2];
                      fVar128 = fVar81 * fVar100 + fVar79 * fVar80;
                      fVar106 = fVar81 * fVar100 - fVar79 * fVar80;
                      fVar112 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar100 * fVar100 +
                                -fVar80 * fVar80;
                      fVar125 = fVar79 * fVar79 - fVar81 * fVar81;
                      fVar126 = fVar100 * fVar100 + fVar125 + -fVar80 * fVar80;
                      fVar137 = fVar81 * fVar80 - fVar79 * fVar100;
                      fVar94 = fVar79 * fVar100 + fVar81 * fVar80;
                      fVar134 = fVar100 * fVar80 + fVar79 * fVar81;
                      fVar79 = fVar100 * fVar80 - fVar79 * fVar81;
                      pfVar2 = (float *)(lVar15 + lVar74);
                      fVar105 = *pfVar2;
                      fVar7 = pfVar2[1];
                      fVar8 = pfVar2[2];
                      fVar128 = fVar128 + fVar128;
                      fVar137 = fVar137 + fVar137;
                      fVar106 = fVar106 + fVar106;
                      fVar134 = fVar134 + fVar134;
                      fVar94 = fVar94 + fVar94;
                      fVar79 = fVar79 + fVar79;
                      fVar81 = fVar80 * fVar80 + fVar125 + -fVar100 * fVar100;
                      fVar113 = fVar112 * 1.0 + fVar128 * 0.0 + fVar137 * 0.0;
                      fVar115 = fVar112 * 0.0 + fVar128 * 1.0 + fVar137 * 0.0;
                      fVar118 = fVar112 * 0.0 + fVar128 * 0.0 + fVar137 * 1.0;
                      fVar120 = fVar112 * 0.0 + fVar128 * 0.0 + fVar137 * 0.0;
                      fVar107 = fVar106 * 1.0 + fVar126 * 0.0 + fVar134 * 0.0;
                      fVar108 = fVar106 * 0.0 + fVar126 * 1.0 + fVar134 * 0.0;
                      fVar109 = fVar106 * 0.0 + fVar126 * 0.0 + fVar134 * 1.0;
                      fVar111 = fVar106 * 0.0 + fVar126 * 0.0 + fVar134 * 0.0;
                      fVar106 = fVar94 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                      fVar112 = fVar94 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                      fVar128 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                      fVar137 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                      local_168 = auVar10._4_4_;
                      fStack_164 = auVar10._8_4_;
                      local_178 = auVar10._0_4_;
                      fVar129 = local_178 * fVar113 + fVar107 * 0.0 + fVar106 * 0.0;
                      fVar131 = local_178 * fVar115 + fVar108 * 0.0 + fVar112 * 0.0;
                      fVar132 = local_178 * fVar118 + fVar109 * 0.0 + fVar128 * 0.0;
                      fVar133 = local_178 * fVar120 + fVar111 * 0.0 + fVar137 * 0.0;
                      fVar125 = fVar122 * fVar113 + fVar127 * fVar107 + fVar106 * 0.0;
                      fVar126 = fVar122 * fVar115 + fVar127 * fVar108 + fVar112 * 0.0;
                      fVar134 = fVar122 * fVar118 + fVar127 * fVar109 + fVar128 * 0.0;
                      fVar95 = fVar122 * fVar120 + fVar127 * fVar111 + fVar137 * 0.0;
                      local_148.l.vz.field_0.m128[0] =
                           fVar110 * fVar113 + fVar101 * fVar107 + fVar104 * fVar106;
                      local_148.l.vz.field_0.m128[1] =
                           fVar110 * fVar115 + fVar101 * fVar108 + fVar104 * fVar112;
                      local_148.l.vz.field_0.m128[2] =
                           fVar110 * fVar118 + fVar101 * fVar109 + fVar104 * fVar128;
                      local_148.l.vz.field_0.m128[3] =
                           fVar110 * fVar120 + fVar101 * fVar111 + fVar104 * fVar137;
                      fVar79 = (pAVar14->p).field_0.m128[3];
                      fVar81 = (pAVar14->l).vx.field_0.m128[3];
                      fVar100 = (pAVar14->l).vy.field_0.m128[3];
                      fVar80 = (pAVar14->l).vz.field_0.m128[3];
                      fVar130 = fVar81 * fVar100 + fVar79 * fVar80;
                      fVar96 = fVar81 * fVar100 - fVar79 * fVar80;
                      fVar97 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar100 * fVar100 +
                               -fVar80 * fVar80;
                      fVar127 = fVar79 * fVar79 - fVar81 * fVar81;
                      fVar136 = fVar100 * fVar100 + fVar127 + -fVar80 * fVar80;
                      fVar135 = fVar81 * fVar80 - fVar79 * fVar100;
                      fVar102 = fVar79 * fVar100 + fVar81 * fVar80;
                      fVar138 = fVar100 * fVar80 + fVar79 * fVar81;
                      fVar94 = fVar100 * fVar80 - fVar79 * fVar81;
                      fVar79 = (pAVar14->l).vx.field_0.m128[0];
                      fVar81 = (pAVar14->l).vy.field_0.m128[0];
                      fVar122 = (pAVar14->l).vy.field_0.m128[1];
                      fVar121 = fVar80 * fVar80 + fVar127 + -fVar100 * fVar100;
                      fVar100 = (pAVar14->l).vz.field_0.m128[0];
                      fVar80 = (pAVar14->l).vz.field_0.m128[1];
                      fVar127 = (pAVar14->l).vz.field_0.m128[2];
                      fVar130 = fVar130 + fVar130;
                      fVar135 = fVar135 + fVar135;
                      fVar110 = (pAVar14->p).field_0.m128[0];
                      fVar101 = (pAVar14->p).field_0.m128[1];
                      fVar104 = (pAVar14->p).field_0.m128[2];
                      fVar98 = fVar97 * 1.0 + fVar130 * 0.0 + fVar135 * 0.0;
                      fVar99 = fVar97 * 0.0 + fVar130 * 1.0 + fVar135 * 0.0;
                      fVar135 = fVar97 * 0.0 + fVar130 * 0.0 + fVar135 * 1.0;
                      fVar96 = fVar96 + fVar96;
                      fVar138 = fVar138 + fVar138;
                      fVar102 = fVar102 + fVar102;
                      fVar94 = fVar94 + fVar94;
                      fVar97 = fVar96 * 1.0 + fVar136 * 0.0 + fVar138 * 0.0;
                      fVar130 = fVar96 * 0.0 + fVar136 * 1.0 + fVar138 * 0.0;
                      fVar96 = fVar96 * 0.0 + fVar136 * 0.0 + fVar138 * 1.0;
                      fVar136 = fVar102 * 1.0 + fVar94 * 0.0 + fVar121 * 0.0;
                      fVar138 = fVar102 * 0.0 + fVar94 * 1.0 + fVar121 * 0.0;
                      fVar94 = fVar102 * 0.0 + fVar94 * 0.0 + fVar121 * 1.0;
                      fVar114 = fVar79 * fVar98 + fVar97 * 0.0 + fVar136 * 0.0;
                      fVar116 = fVar79 * fVar99 + fVar130 * 0.0 + fVar138 * 0.0;
                      fVar119 = fVar79 * fVar135 + fVar96 * 0.0 + fVar94 * 0.0;
                      fVar102 = fVar81 * fVar98 + fVar122 * fVar97 + fVar136 * 0.0;
                      fVar121 = fVar81 * fVar99 + fVar122 * fVar130 + fVar138 * 0.0;
                      fVar103 = fVar81 * fVar135 + fVar122 * fVar96 + fVar94 * 0.0;
                      fVar122 = fVar100 * fVar98 + fVar80 * fVar97 + fVar127 * fVar136;
                      fVar123 = fVar100 * fVar99 + fVar80 * fVar130 + fVar127 * fVar138;
                      fVar124 = fVar100 * fVar135 + fVar80 * fVar96 + fVar127 * fVar94;
                      fVar127 = fVar110 * fVar98 + fVar101 * fVar97 + fVar104 * fVar136 +
                                (pAVar14->l).vx.field_0.m128[1] + 0.0;
                      fVar97 = fVar110 * fVar99 + fVar101 * fVar130 + fVar104 * fVar138 +
                               (pAVar14->l).vx.field_0.m128[2] + 0.0;
                      fVar110 = fVar110 * fVar135 + fVar101 * fVar96 + fVar104 * fVar94 +
                                (pAVar14->l).vy.field_0.m128[2] + 0.0;
                      fVar80 = fVar114 * fVar129 +
                               fVar116 * fVar125 + fVar119 * local_148.l.vz.field_0.m128[0];
                      local_178 = fVar114 * fVar131 +
                                  fVar116 * fVar126 + fVar119 * local_148.l.vz.field_0.m128[1];
                      fVar81 = fVar114 * fVar132 +
                               fVar116 * fVar134 + fVar119 * local_148.l.vz.field_0.m128[2];
                      fVar79 = fVar122 * fVar129 +
                               fVar123 * fVar125 + fVar124 * local_148.l.vz.field_0.m128[0];
                      fVar100 = fVar122 * fVar131 +
                                fVar123 * fVar126 + fVar124 * local_148.l.vz.field_0.m128[1];
                      fVar101 = fVar122 * fVar132 +
                                fVar123 * fVar134 + fVar124 * local_148.l.vz.field_0.m128[2];
                      uVar71 = extraout_RDX_08;
                      fVar104 = fVar122 * fVar133 +
                                fVar123 * fVar95 + fVar124 * local_148.l.vz.field_0.m128[3];
                      fVar122 = fVar114 * fVar133 +
                                fVar116 * fVar95 + fVar119 * local_148.l.vz.field_0.m128[3];
                      fVar94 = fVar127 * fVar129 +
                               fVar97 * fVar125 + fVar110 * local_148.l.vz.field_0.m128[0] +
                               fVar105 * fVar113 + fVar7 * fVar107 + fVar8 * fVar106 +
                               local_168 + 0.0;
                      fVar106 = fVar127 * fVar131 +
                                fVar97 * fVar126 + fVar110 * local_148.l.vz.field_0.m128[1] +
                                fVar105 * fVar115 + fVar7 * fVar108 + fVar8 * fVar112 +
                                fStack_164 + 0.0;
                      fVar112 = fVar127 * fVar132 +
                                fVar97 * fVar134 + fVar110 * local_148.l.vz.field_0.m128[2] +
                                fVar105 * fVar118 + fVar7 * fVar109 + fVar8 * fVar128 +
                                pfVar1[2] + 0.0;
                      fVar105 = fVar127 * fVar133 +
                                fVar97 * fVar95 + fVar110 * local_148.l.vz.field_0.m128[3] +
                                fVar105 * fVar120 + fVar7 * fVar111 + fVar8 * fVar137 + 0.0;
                      uVar62 = fVar102 * fVar129 +
                               fVar121 * fVar125 + fVar103 * local_148.l.vz.field_0.m128[0];
                      uVar117 = fVar102 * fVar131 +
                                fVar121 * fVar126 + fVar103 * local_148.l.vz.field_0.m128[1];
                      fVar127 = fVar102 * fVar132 +
                                fVar121 * fVar134 + fVar103 * local_148.l.vz.field_0.m128[2];
                      fVar110 = fVar102 * fVar133 +
                                fVar121 * fVar95 + fVar103 * local_148.l.vz.field_0.m128[3];
                    }
                    else {
                      bVar61 = bVar61 ^ 1 | bVar11;
                      if (bVar61 == 0) {
                        local_d8 = ZEXT416(*(uint *)(lVar15 + 0xc + lVar74));
                        local_b8 = ZEXT416(*(uint *)(lVar15 + -0x24 + lVar74));
                        local_a8 = ZEXT416(*(uint *)(lVar15 + -0x14 + lVar74));
                        local_e8 = ZEXT416(*(uint *)(lVar15 + -4 + lVar74));
                        pfVar1 = (float *)(lVar15 + -0x20 + lVar74);
                        local_108 = *pfVar1;
                        fStack_104 = pfVar1[1];
                        fStack_c0 = pfVar1[2];
                        fStack_fc = pfVar1[3];
                        pfVar1 = (float *)(lVar15 + -0x10 + lVar74);
                        local_f8 = *pfVar1;
                        fStack_f4 = pfVar1[1];
                        fStack_f0 = pfVar1[2];
                        fStack_ec = pfVar1[3];
                        pfVar1 = (float *)(lVar15 + -0x30 + lVar74);
                        local_88 = *pfVar1;
                        fStack_7c = pfVar1[1];
                        fVar79 = (pAVar14->l).vx.field_0.m128[0];
                        fVar100 = (pAVar14->l).vx.field_0.m128[1];
                        fVar122 = (pAVar14->l).vx.field_0.m128[2];
                        fVar127 = (pAVar14->l).vy.field_0.m128[0];
                        fVar110 = (pAVar14->l).vy.field_0.m128[1];
                        fVar101 = (pAVar14->l).vy.field_0.m128[2];
                        local_148.p.field_0._0_8_ = *(undefined8 *)&(pAVar14->l).vz.field_0;
                        local_148.p.field_0._8_8_ =
                             *(undefined8 *)((long)&(pAVar14->l).vz.field_0 + 8);
                        fVar104 = (pAVar14->p).field_0.m128[0];
                        fVar94 = (pAVar14->p).field_0.m128[1];
                        fVar106 = (pAVar14->p).field_0.m128[2];
                        fVar80 = fVar79 * local_88 + fVar100 * local_108 + fVar122 * local_f8;
                        fVar112 = fVar79 * 0.0 + fVar100 * fStack_104 + fVar122 * fStack_f4;
                        fVar79 = fVar79 * 0.0 + fVar100 * 0.0 + fVar122 * fStack_f0;
                        local_148.l.vz.field_0.m128[0] =
                             fVar127 * local_88 + fVar110 * local_108 + fVar101 * local_f8;
                        local_148.l.vz.field_0.m128[1] =
                             fVar127 * 0.0 + fVar110 * fStack_104 + fVar101 * fStack_f4;
                        local_148.l.vz.field_0.m128[2] =
                             fVar127 * 0.0 + fVar110 * 0.0 + fVar101 * fStack_f0;
                        local_148.l.vz.field_0.m128[3] =
                             fVar127 * fStack_7c + fVar110 * fStack_fc + fVar101 * fStack_ec;
                        fStack_100 = 0.0;
                        fStack_84 = 0.0;
                        fStack_80 = 0.0;
                        pfVar1 = (float *)(lVar15 + lVar74);
                        local_98._0_4_ =
                             fVar104 * local_88 + fVar94 * local_108 + fVar106 * local_f8 + *pfVar1;
                        local_98._4_4_ =
                             fVar104 * 0.0 + fVar94 * fStack_104 + fVar106 * fStack_f4 + pfVar1[1];
                        fStack_90 = fVar104 * 0.0 + fVar94 * 0.0 + fVar106 * fStack_f0 + pfVar1[2];
                        register0x0000128c =
                             fVar104 * fStack_7c + fVar94 * fStack_fc + fVar106 * fStack_ec +
                             pfVar1[3];
                        local_c8 = local_108;
                        fStack_c4 = fStack_104;
                        fStack_bc = fStack_fc;
                        if (((fVar112 != 0.0) || (NAN(fVar112))) ||
                           ((fVar79 != 0.0 ||
                            (((NAN(fVar79) || (local_148.l.vz.field_0.m128[2] != 0.0)) ||
                             (NAN(local_148.l.vz.field_0.m128[2]))))))) {
                          poVar64 = std::operator<<((ostream *)&std::cout,
                                                                                                        
                                                  "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                                  );
                          std::endl<char,std::char_traits<char>>(poVar64);
                          uVar71 = extraout_RDX_10;
                        }
                        fVar79 = local_88 * local_148.p.field_0.m128[0] +
                                 local_108 * local_148.p.field_0.m128[1] +
                                 local_f8 * local_148.p.field_0.m128[2];
                        fVar100 = fStack_84 * local_148.p.field_0.m128[0] +
                                  fStack_104 * local_148.p.field_0.m128[1] +
                                  fStack_f4 * local_148.p.field_0.m128[2];
                        fVar101 = fStack_80 * local_148.p.field_0.m128[0] +
                                  fStack_100 * local_148.p.field_0.m128[1] +
                                  fStack_f0 * local_148.p.field_0.m128[2];
                        local_148.l.vy.field_0._8_1_ = 1;
                        fVar104 = (float)local_e8._0_4_;
                        fVar122 = (float)local_b8._0_4_;
                        fVar94 = (float)local_98._0_4_;
                        fVar106 = (float)local_98._4_4_;
                        fVar112 = fStack_90;
                        fVar105 = (float)local_d8._0_4_;
                        uVar62 = local_148.l.vz.field_0.m128[0];
                        uVar117 = local_148.l.vz.field_0.m128[1];
                        fVar127 = fStack_c0;
                        fVar110 = (float)local_a8._0_4_;
                      }
                      else {
                        if (((local_178 != 0.0) || (NAN(local_178))) ||
                           ((fVar81 != 0.0 ||
                            ((NAN(fVar81) ||
                             (uVar66 = *(undefined8 *)(lVar15 + -0x10 + lVar74),
                             auVar38._4_4_ = -(uint)(*(float *)(lVar15 + -0x20 + lVar74) != 0.0),
                             auVar38._0_4_ = -(uint)(*(float *)(lVar15 + -0x18 + lVar74) != 0.0),
                             auVar38._8_4_ = -(uint)((float)uVar66 != 0.0),
                             auVar38._12_4_ = -(uint)((float)((ulong)uVar66 >> 0x20) != 0.0),
                             uVar62 = movmskps((int)CONCAT71(uVar69,bVar61),auVar38),
                             (char)uVar62 != '\0')))))) {
                          poVar64 = std::operator<<((ostream *)&std::cout,
                                                                                                        
                                                  "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                                  );
                          std::endl<char,std::char_traits<char>>(poVar64);
                          uVar71 = extraout_RDX_09;
                        }
                        fVar79 = (pAVar14->l).vz.field_0.m128[0];
                        fVar100 = (pAVar14->l).vz.field_0.m128[1];
                        fVar80 = *(float *)(lVar15 + -0x30 + lVar74) *
                                 (pAVar14->l).vx.field_0.m128[0];
                        local_178 = (pAVar14->l).vx.field_0.m128[1] +
                                    (float)*(undefined8 *)(lVar15 + lVar74);
                        fVar81 = (pAVar14->l).vx.field_0.m128[2] +
                                 (float)((ulong)*(undefined8 *)(lVar15 + lVar74) >> 0x20);
                        fVar101 = (pAVar14->l).vz.field_0.m128[2] * *(float *)(lVar15 + -8 + lVar74)
                        ;
                        local_148.l.vy.field_0._8_1_ = 1;
                        fVar104 = (pAVar14->l).vz.field_0.m128[3];
                        fVar122 = (pAVar14->l).vx.field_0.m128[3];
                        fVar94 = (pAVar14->p).field_0.m128[0];
                        fVar106 = (pAVar14->p).field_0.m128[1];
                        fVar112 = (pAVar14->p).field_0.m128[2];
                        fVar105 = (pAVar14->p).field_0.m128[3];
                        uVar62 = (pAVar14->l).vy.field_0.m128[0];
                        uVar117 = (pAVar14->l).vy.field_0.m128[1] *
                                  *(float *)(lVar15 + -0x1c + lVar74);
                        fVar127 = (pAVar14->l).vy.field_0.m128[2] + *(float *)(lVar15 + 8 + lVar74);
                        fVar110 = (pAVar14->l).vy.field_0.m128[3];
                      }
                    }
                  }
                }
                else {
                  pfVar1 = (float *)(lVar15 + -0x24 + lVar74);
                  auVar35._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar35._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar35._8_4_ = -(uint)(pfVar1[2] != 1.0);
                  auVar35._12_4_ = -(uint)(pfVar1[3] != 0.0);
                  uVar75 = movmskps(uVar75,auVar35);
                  if ((((bVar61 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                     (((uVar75 & 4) != 0 ||
                      (bVar70 = ((byte)uVar75 & 8) >> 3,
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 != 0))))
                  goto LAB_001529ac;
                  pfVar1 = (float *)(lVar15 + -0x14 + lVar74);
                  auVar36._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar36._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar36._8_4_ = -(uint)(pfVar1[2] != 0.0);
                  auVar36._12_4_ = -(uint)(pfVar1[3] != 1.0);
                  uVar75 = movmskps(uVar75,auVar36);
                  if (((((bVar61 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                      ((uVar75 & 4) != 0)) ||
                     (bVar70 = ((byte)uVar75 & 8) >> 3,
                     uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 != 0)) goto LAB_001529ac;
                  pfVar1 = (float *)(lVar15 + -4 + lVar74);
                  auVar37._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar37._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar37._8_4_ = -(uint)(pfVar1[2] != 0.0);
                  auVar37._12_4_ = -(uint)(pfVar1[3] != 0.0);
                  uVar75 = movmskps(uVar75,auVar37);
                  if ((((bVar61 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0)
                     ) goto LAB_001529ac;
                  bVar70 = ((byte)uVar75 & 8) >> 3;
                  uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
                  uVar71 = (ulong)uVar75;
                  if ((bVar70 != 0) ||
                     ((bVar61 != 0 &&
                      ((fVar79 = *(float *)(lVar15 + 0xc + lVar74), fVar79 != 1.0 || (NAN(fVar79))))
                      ))) goto LAB_001529ac;
                  fVar80 = (pAVar14->l).vx.field_0.m128[0];
                  local_178 = (pAVar14->l).vx.field_0.m128[1];
                  fVar81 = (pAVar14->l).vx.field_0.m128[2];
                  fVar122 = (pAVar14->l).vx.field_0.m128[3];
                  uVar62 = (pAVar14->l).vy.field_0.m128[0];
                  uVar117 = (pAVar14->l).vy.field_0.m128[1];
                  fVar127 = (pAVar14->l).vy.field_0.m128[2];
                  fVar110 = (pAVar14->l).vy.field_0.m128[3];
                  fVar79 = (pAVar14->l).vz.field_0.m128[0];
                  fVar100 = (pAVar14->l).vz.field_0.m128[1];
                  fVar101 = (pAVar14->l).vz.field_0.m128[2];
                  fVar104 = (pAVar14->l).vz.field_0.m128[3];
                  fVar94 = (pAVar14->p).field_0.m128[0];
                  fVar106 = (pAVar14->p).field_0.m128[1];
                  fVar112 = (pAVar14->p).field_0.m128[2];
                  fVar105 = (pAVar14->p).field_0.m128[3];
                  local_148.l.vy.field_0._8_1_ = bVar11;
                }
LAB_001530ca:
                pfVar1 = (float *)((long)&((Vector *)(local_148.l.vy.field_0._0_8_ + -0x30))->
                                          field_0 + lVar74);
                *pfVar1 = fVar80;
                pfVar1[1] = local_178;
                pfVar1[2] = fVar81;
                pfVar1[3] = fVar122;
                pfVar1 = (float *)((long)&((Vector *)(local_148.l.vy.field_0._0_8_ + -0x20))->
                                          field_0 + lVar74);
                *pfVar1 = (float)uVar62;
                pfVar1[1] = (float)uVar117;
                pfVar1[2] = fVar127;
                pfVar1[3] = fVar110;
                pfVar1 = (float *)((long)&((Vector *)(local_148.l.vy.field_0._0_8_ + -0x10))->
                                          field_0 + lVar74);
                *pfVar1 = fVar79;
                pfVar1[1] = fVar100;
                pfVar1[2] = fVar101;
                pfVar1[3] = fVar104;
                pfVar1 = (float *)(local_148.l.vy.field_0._0_8_ + lVar74);
                *pfVar1 = fVar94;
                pfVar1[1] = fVar106;
                pfVar1[2] = fVar112;
                pfVar1[3] = fVar105;
                lVar74 = lVar74 + 0x40;
                uVar66 = local_148.l.vy.field_0._0_8_;
              }
            }
            else {
              if (sVar13 != sVar17) {
                prVar68 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (prVar68,"number of transformations does not match");
                __cxa_throw(prVar68,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              fVar79 = (float)*puVar5;
              fVar81 = (float)((ulong)*puVar5 >> 0x20);
              fVar100 = (spaces->time_range).lower;
              fVar80 = (spaces->time_range).upper;
              uVar75 = -(uint)(fVar79 < fVar100);
              uVar77 = -(uint)(fVar81 < fVar80);
              local_158._0_8_ =
                   CONCAT44(~uVar77 & (uint)fVar80,~uVar75 & (uint)fVar79) |
                   CONCAT44((uint)fVar81 & uVar77,(uint)fVar100 & uVar75);
              local_148.l.vy.field_0._0_8_ =
                   (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
              local_148.l.vx.field_0._0_8_ = 0;
              local_148.l.vx.field_0._8_8_ = 0;
              if (sVar13 != 0) {
                local_148.l.vy.field_0._0_8_ = alignedMalloc(sVar13 << 6,0x10);
                uVar71 = extraout_RDX_11;
                local_148.l.vx.field_0._8_8_ = sVar13;
              }
              uVar66 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
              if (*(char *)(puVar5 + 5) == '\0') {
                uVar66 = ZEXT48(*(uint *)&spaces->quaternion);
              }
              local_148.l.vy.field_0._8_1_ = (undefined1)uVar66;
              lVar74 = 0x30;
              local_148.l.vx.field_0._0_8_ = local_148.l.vx.field_0._8_8_;
              for (uVar72 = 0; uVar75 = (uint)uVar71, uVar72 < (ulong)puVar5[2]; uVar72 = uVar72 + 1
                  ) {
                lVar15 = puVar5[4];
                pAVar14 = (spaces->spaces).items;
                bVar61 = *(byte *)(puVar5 + 5);
                uVar69 = (undefined7)((ulong)uVar66 >> 8);
                uVar67 = CONCAT71(uVar69,bVar61);
                bVar11 = spaces->quaternion;
                local_148.l.vy.field_0._8_1_ = 0;
                fVar79 = *(float *)(lVar15 + -0x30 + lVar74);
                uVar66 = *(undefined8 *)(lVar15 + -0x2c + lVar74);
                fVar81 = (float)((ulong)uVar66 >> 0x20);
                local_178 = (float)uVar66;
                if (((((fVar79 != 1.0) || (NAN(fVar79))) || (local_178 != 0.0)) ||
                    ((NAN(local_178) || (fVar81 != 0.0)))) || (NAN(fVar81))) {
LAB_001535f6:
                  uVar66 = *(undefined8 *)((long)pAVar14 + lVar74 + -0x30);
                  fVar100 = (float)uVar66;
                  fVar122 = (float)((ulong)uVar66 >> 0x20);
                  iVar76 = -(uint)(fVar100 != 1.0);
                  iVar78 = -(uint)(fVar122 != 0.0);
                  auVar89._4_4_ = iVar78;
                  auVar89._0_4_ = iVar76;
                  auVar89._8_4_ = iVar78;
                  auVar89._12_4_ = iVar78;
                  auVar88._8_8_ = auVar89._8_8_;
                  auVar88._4_4_ = iVar76;
                  auVar88._0_4_ = iVar76;
                  uVar75 = movmskpd(uVar75,auVar88);
                  fVar79 = *(float *)((long)pAVar14 + lVar74 + -0x28);
                  if (((((uVar75 & 1) == 0) && (bVar70 = (byte)uVar75 >> 1, bVar70 == 0)) &&
                      (fVar79 == 0.0)) && (!NAN(fVar79))) {
                    pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x24);
                    auVar57._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar57._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar57._8_4_ = -(uint)(pfVar1[2] != 1.0);
                    auVar57._12_4_ = -(uint)(pfVar1[3] != 0.0);
                    uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar57);
                    if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                       (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                      pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x14);
                      auVar58._4_4_ = -(uint)(pfVar1[1] != 0.0);
                      auVar58._0_4_ = -(uint)(*pfVar1 != 0.0);
                      auVar58._8_4_ = -(uint)(pfVar1[2] != 0.0);
                      auVar58._12_4_ = -(uint)(pfVar1[3] != 1.0);
                      uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar58);
                      if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                         (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                        pfVar1 = (float *)((long)pAVar14 + lVar74 + -4);
                        auVar59._4_4_ = -(uint)(pfVar1[1] != 0.0);
                        auVar59._0_4_ = -(uint)(*pfVar1 != 0.0);
                        auVar59._8_4_ = -(uint)(pfVar1[2] != 0.0);
                        auVar59._12_4_ = -(uint)(pfVar1[3] != 0.0);
                        uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar59);
                        if ((((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                             ((uVar75 & 4) == 0)) &&
                            (bVar70 = ((byte)uVar75 & 8) >> 3,
                            uVar71 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 == 0)) &&
                           ((bVar11 == false ||
                            ((fVar80 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 0xc),
                             fVar80 == 1.0 && (!NAN(fVar80))))))) {
                          pfVar1 = (float *)(lVar15 + -0x30 + lVar74);
                          fVar80 = *pfVar1;
                          local_178 = pfVar1[1];
                          fVar81 = pfVar1[2];
                          fVar122 = pfVar1[3];
                          pfVar1 = (float *)(lVar15 + -0x20 + lVar74);
                          uVar62 = *pfVar1;
                          uVar117 = pfVar1[1];
                          fVar127 = pfVar1[2];
                          fVar110 = pfVar1[3];
                          pfVar1 = (float *)(lVar15 + -0x10 + lVar74);
                          fVar79 = *pfVar1;
                          fVar100 = pfVar1[1];
                          fVar101 = pfVar1[2];
                          fVar104 = pfVar1[3];
                          pfVar1 = (float *)(lVar15 + lVar74);
                          fVar94 = *pfVar1;
                          fVar106 = pfVar1[1];
                          fVar112 = pfVar1[2];
                          fVar105 = pfVar1[3];
                          local_148.l.vy.field_0._8_1_ = bVar61;
                          goto LAB_00153d2b;
                        }
                      }
                    }
                  }
                  uVar71 = uVar67 & 0xffffffff;
                  bVar70 = (byte)uVar71 | bVar11;
                  uVar71 = CONCAT71((int7)(uVar71 >> 8),bVar70);
                  if (bVar70 == 0) {
                    pfVar1 = (float *)(lVar15 + -0x30 + lVar74);
                    fVar112 = *pfVar1;
                    fVar125 = pfVar1[1];
                    fVar126 = pfVar1[2];
                    fVar128 = pfVar1[3];
                    pfVar1 = (float *)(lVar15 + -0x20 + lVar74);
                    fVar134 = *pfVar1;
                    fVar137 = pfVar1[1];
                    fVar95 = pfVar1[2];
                    fVar96 = pfVar1[3];
                    pfVar1 = (float *)(lVar15 + -0x10 + lVar74);
                    fVar97 = *pfVar1;
                    fVar130 = pfVar1[1];
                    fVar98 = pfVar1[2];
                    fVar99 = pfVar1[3];
                    fVar80 = fVar100 * fVar112 + fVar122 * fVar134 + fVar79 * fVar97;
                    local_178 = fVar100 * fVar125 + fVar122 * fVar137 + fVar79 * fVar130;
                    fVar81 = fVar100 * fVar126 + fVar122 * fVar95 + fVar79 * fVar98;
                    fVar122 = fVar100 * fVar128 + fVar122 * fVar96 + fVar79 * fVar99;
                    fVar79 = *(float *)((long)pAVar14 + lVar74 + -0x20);
                    fVar100 = *(float *)((long)pAVar14 + lVar74 + -0x1c);
                    fVar110 = *(float *)((long)pAVar14 + lVar74 + -0x18);
                    fVar104 = *(float *)((long)pAVar14 + lVar74 + -0x10);
                    uVar62 = fVar79 * fVar112 + fVar100 * fVar134 + fVar110 * fVar97;
                    uVar117 = fVar79 * fVar125 + fVar100 * fVar137 + fVar110 * fVar130;
                    fVar127 = fVar79 * fVar126 + fVar100 * fVar95 + fVar110 * fVar98;
                    fVar110 = fVar79 * fVar128 + fVar100 * fVar96 + fVar110 * fVar99;
                    fVar94 = *(float *)((long)pAVar14 + lVar74 + -0xc);
                    fVar106 = *(float *)((long)pAVar14 + lVar74 + -8);
                    fVar79 = fVar104 * fVar112 + fVar94 * fVar134 + fVar106 * fVar97;
                    fVar100 = fVar104 * fVar125 + fVar94 * fVar137 + fVar106 * fVar130;
                    fVar101 = fVar104 * fVar126 + fVar94 * fVar95 + fVar106 * fVar98;
                    fVar104 = fVar104 * fVar128 + fVar94 * fVar96 + fVar106 * fVar99;
                    fVar105 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                    fVar7 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 4);
                    fVar8 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 8);
                    pfVar1 = (float *)(lVar15 + lVar74);
                    fVar94 = fVar105 * fVar112 + fVar7 * fVar134 + fVar8 * fVar97 + *pfVar1;
                    fVar106 = fVar105 * fVar125 + fVar7 * fVar137 + fVar8 * fVar130 + pfVar1[1];
                    fVar112 = fVar105 * fVar126 + fVar7 * fVar95 + fVar8 * fVar98 + pfVar1[2];
                    fVar105 = fVar105 * fVar128 + fVar7 * fVar96 + fVar8 * fVar99 + pfVar1[3];
                  }
                  else {
                    uVar67 = uVar67 & 0xffffffff;
                    bVar70 = (byte)uVar67 & bVar11;
                    uVar71 = CONCAT71((int7)(uVar67 >> 8),bVar70);
                    if (bVar70 == 1) {
                      poVar64 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar64);
                      fVar79 = *(float *)(lVar15 + 0xc + lVar74);
                      fVar81 = *(float *)(lVar15 + -0x24 + lVar74);
                      fVar100 = *(float *)(lVar15 + -0x14 + lVar74);
                      fVar80 = *(float *)(lVar15 + -4 + lVar74);
                      auVar10 = *(undefined1 (*) [16])(lVar15 + -0x30 + lVar74);
                      pfVar1 = (float *)(lVar15 + -0x20 + lVar74);
                      fVar122 = *pfVar1;
                      fVar127 = pfVar1[1];
                      pfVar2 = (float *)(lVar15 + -0x10 + lVar74);
                      fVar110 = *pfVar2;
                      fVar101 = pfVar2[1];
                      fVar104 = pfVar2[2];
                      fVar128 = fVar81 * fVar100 + fVar79 * fVar80;
                      fVar106 = fVar81 * fVar100 - fVar79 * fVar80;
                      fVar112 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar100 * fVar100 +
                                -fVar80 * fVar80;
                      fVar125 = fVar79 * fVar79 - fVar81 * fVar81;
                      fVar126 = fVar100 * fVar100 + fVar125 + -fVar80 * fVar80;
                      fVar137 = fVar81 * fVar80 - fVar79 * fVar100;
                      fVar94 = fVar79 * fVar100 + fVar81 * fVar80;
                      fVar134 = fVar100 * fVar80 + fVar79 * fVar81;
                      fVar79 = fVar100 * fVar80 - fVar79 * fVar81;
                      pfVar2 = (float *)(lVar15 + lVar74);
                      fVar105 = *pfVar2;
                      fVar7 = pfVar2[1];
                      fVar8 = pfVar2[2];
                      fVar128 = fVar128 + fVar128;
                      fVar137 = fVar137 + fVar137;
                      fVar106 = fVar106 + fVar106;
                      fVar134 = fVar134 + fVar134;
                      fVar94 = fVar94 + fVar94;
                      fVar79 = fVar79 + fVar79;
                      fVar81 = fVar80 * fVar80 + fVar125 + -fVar100 * fVar100;
                      fVar113 = fVar112 * 1.0 + fVar128 * 0.0 + fVar137 * 0.0;
                      fVar115 = fVar112 * 0.0 + fVar128 * 1.0 + fVar137 * 0.0;
                      fVar118 = fVar112 * 0.0 + fVar128 * 0.0 + fVar137 * 1.0;
                      fVar120 = fVar112 * 0.0 + fVar128 * 0.0 + fVar137 * 0.0;
                      fVar107 = fVar106 * 1.0 + fVar126 * 0.0 + fVar134 * 0.0;
                      fVar108 = fVar106 * 0.0 + fVar126 * 1.0 + fVar134 * 0.0;
                      fVar109 = fVar106 * 0.0 + fVar126 * 0.0 + fVar134 * 1.0;
                      fVar111 = fVar106 * 0.0 + fVar126 * 0.0 + fVar134 * 0.0;
                      fVar106 = fVar94 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                      fVar112 = fVar94 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                      fVar128 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                      fVar137 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                      local_168 = auVar10._4_4_;
                      fStack_164 = auVar10._8_4_;
                      local_178 = auVar10._0_4_;
                      fVar129 = local_178 * fVar113 + fVar107 * 0.0 + fVar106 * 0.0;
                      fVar131 = local_178 * fVar115 + fVar108 * 0.0 + fVar112 * 0.0;
                      fVar132 = local_178 * fVar118 + fVar109 * 0.0 + fVar128 * 0.0;
                      fVar133 = local_178 * fVar120 + fVar111 * 0.0 + fVar137 * 0.0;
                      fVar125 = fVar122 * fVar113 + fVar127 * fVar107 + fVar106 * 0.0;
                      fVar126 = fVar122 * fVar115 + fVar127 * fVar108 + fVar112 * 0.0;
                      fVar134 = fVar122 * fVar118 + fVar127 * fVar109 + fVar128 * 0.0;
                      fVar95 = fVar122 * fVar120 + fVar127 * fVar111 + fVar137 * 0.0;
                      local_148.l.vz.field_0.m128[0] =
                           fVar110 * fVar113 + fVar101 * fVar107 + fVar104 * fVar106;
                      local_148.l.vz.field_0.m128[1] =
                           fVar110 * fVar115 + fVar101 * fVar108 + fVar104 * fVar112;
                      local_148.l.vz.field_0.m128[2] =
                           fVar110 * fVar118 + fVar101 * fVar109 + fVar104 * fVar128;
                      local_148.l.vz.field_0.m128[3] =
                           fVar110 * fVar120 + fVar101 * fVar111 + fVar104 * fVar137;
                      fVar79 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 0xc);
                      fVar81 = *(float *)((long)pAVar14 + lVar74 + -0x24);
                      fVar100 = *(float *)((long)pAVar14 + lVar74 + -0x14);
                      fVar80 = *(float *)((long)pAVar14 + lVar74 + -4);
                      fVar130 = fVar81 * fVar100 + fVar79 * fVar80;
                      fVar96 = fVar81 * fVar100 - fVar79 * fVar80;
                      fVar97 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar100 * fVar100 +
                               -fVar80 * fVar80;
                      fVar127 = fVar79 * fVar79 - fVar81 * fVar81;
                      fVar136 = fVar100 * fVar100 + fVar127 + -fVar80 * fVar80;
                      fVar135 = fVar81 * fVar80 - fVar79 * fVar100;
                      fVar102 = fVar79 * fVar100 + fVar81 * fVar80;
                      fVar138 = fVar100 * fVar80 + fVar79 * fVar81;
                      fVar94 = fVar100 * fVar80 - fVar79 * fVar81;
                      pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x30);
                      fVar79 = *pfVar2;
                      pfVar3 = (float *)((long)pAVar14 + lVar74 + -0x20);
                      fVar81 = *pfVar3;
                      fVar122 = pfVar3[1];
                      fVar121 = fVar80 * fVar80 + fVar127 + -fVar100 * fVar100;
                      pfVar4 = (float *)((long)pAVar14 + lVar74 + -0x10);
                      fVar100 = *pfVar4;
                      fVar80 = pfVar4[1];
                      fVar127 = pfVar4[2];
                      fVar130 = fVar130 + fVar130;
                      fVar135 = fVar135 + fVar135;
                      pfVar4 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                      fVar110 = *pfVar4;
                      fVar101 = pfVar4[1];
                      fVar104 = pfVar4[2];
                      fVar98 = fVar97 * 1.0 + fVar130 * 0.0 + fVar135 * 0.0;
                      fVar99 = fVar97 * 0.0 + fVar130 * 1.0 + fVar135 * 0.0;
                      fVar135 = fVar97 * 0.0 + fVar130 * 0.0 + fVar135 * 1.0;
                      fVar96 = fVar96 + fVar96;
                      fVar138 = fVar138 + fVar138;
                      fVar102 = fVar102 + fVar102;
                      fVar94 = fVar94 + fVar94;
                      fVar97 = fVar96 * 1.0 + fVar136 * 0.0 + fVar138 * 0.0;
                      fVar130 = fVar96 * 0.0 + fVar136 * 1.0 + fVar138 * 0.0;
                      fVar96 = fVar96 * 0.0 + fVar136 * 0.0 + fVar138 * 1.0;
                      fVar136 = fVar102 * 1.0 + fVar94 * 0.0 + fVar121 * 0.0;
                      fVar138 = fVar102 * 0.0 + fVar94 * 1.0 + fVar121 * 0.0;
                      fVar94 = fVar102 * 0.0 + fVar94 * 0.0 + fVar121 * 1.0;
                      fVar114 = fVar79 * fVar98 + fVar97 * 0.0 + fVar136 * 0.0;
                      fVar116 = fVar79 * fVar99 + fVar130 * 0.0 + fVar138 * 0.0;
                      fVar119 = fVar79 * fVar135 + fVar96 * 0.0 + fVar94 * 0.0;
                      fVar102 = fVar81 * fVar98 + fVar122 * fVar97 + fVar136 * 0.0;
                      fVar121 = fVar81 * fVar99 + fVar122 * fVar130 + fVar138 * 0.0;
                      fVar103 = fVar81 * fVar135 + fVar122 * fVar96 + fVar94 * 0.0;
                      fVar122 = fVar100 * fVar98 + fVar80 * fVar97 + fVar127 * fVar136;
                      fVar123 = fVar100 * fVar99 + fVar80 * fVar130 + fVar127 * fVar138;
                      fVar124 = fVar100 * fVar135 + fVar80 * fVar96 + fVar127 * fVar94;
                      fVar127 = fVar110 * fVar98 + fVar101 * fVar97 + fVar104 * fVar136 +
                                pfVar2[1] + 0.0;
                      fVar97 = fVar110 * fVar99 + fVar101 * fVar130 + fVar104 * fVar138 +
                               pfVar2[2] + 0.0;
                      fVar110 = fVar110 * fVar135 + fVar101 * fVar96 + fVar104 * fVar94 +
                                pfVar3[2] + 0.0;
                      fVar80 = fVar114 * fVar129 +
                               fVar116 * fVar125 + fVar119 * local_148.l.vz.field_0.m128[0];
                      local_178 = fVar114 * fVar131 +
                                  fVar116 * fVar126 + fVar119 * local_148.l.vz.field_0.m128[1];
                      fVar81 = fVar114 * fVar132 +
                               fVar116 * fVar134 + fVar119 * local_148.l.vz.field_0.m128[2];
                      fVar79 = fVar122 * fVar129 +
                               fVar123 * fVar125 + fVar124 * local_148.l.vz.field_0.m128[0];
                      fVar100 = fVar122 * fVar131 +
                                fVar123 * fVar126 + fVar124 * local_148.l.vz.field_0.m128[1];
                      fVar101 = fVar122 * fVar132 +
                                fVar123 * fVar134 + fVar124 * local_148.l.vz.field_0.m128[2];
                      uVar71 = extraout_RDX_12;
                      fVar104 = fVar122 * fVar133 +
                                fVar123 * fVar95 + fVar124 * local_148.l.vz.field_0.m128[3];
                      fVar122 = fVar114 * fVar133 +
                                fVar116 * fVar95 + fVar119 * local_148.l.vz.field_0.m128[3];
                      fVar94 = fVar127 * fVar129 +
                               fVar97 * fVar125 + fVar110 * local_148.l.vz.field_0.m128[0] +
                               fVar105 * fVar113 + fVar7 * fVar107 + fVar8 * fVar106 +
                               local_168 + 0.0;
                      fVar106 = fVar127 * fVar131 +
                                fVar97 * fVar126 + fVar110 * local_148.l.vz.field_0.m128[1] +
                                fVar105 * fVar115 + fVar7 * fVar108 + fVar8 * fVar112 +
                                fStack_164 + 0.0;
                      fVar112 = fVar127 * fVar132 +
                                fVar97 * fVar134 + fVar110 * local_148.l.vz.field_0.m128[2] +
                                fVar105 * fVar118 + fVar7 * fVar109 + fVar8 * fVar128 +
                                pfVar1[2] + 0.0;
                      fVar105 = fVar127 * fVar133 +
                                fVar97 * fVar95 + fVar110 * local_148.l.vz.field_0.m128[3] +
                                fVar105 * fVar120 + fVar7 * fVar111 + fVar8 * fVar137 + 0.0;
                      uVar62 = fVar102 * fVar129 +
                               fVar121 * fVar125 + fVar103 * local_148.l.vz.field_0.m128[0];
                      uVar117 = fVar102 * fVar131 +
                                fVar121 * fVar126 + fVar103 * local_148.l.vz.field_0.m128[1];
                      fVar127 = fVar102 * fVar132 +
                                fVar121 * fVar134 + fVar103 * local_148.l.vz.field_0.m128[2];
                      fVar110 = fVar102 * fVar133 +
                                fVar121 * fVar95 + fVar103 * local_148.l.vz.field_0.m128[3];
                    }
                    else {
                      bVar61 = bVar61 ^ 1 | bVar11;
                      if (bVar61 == 0) {
                        local_d8 = ZEXT416(*(uint *)(lVar15 + 0xc + lVar74));
                        local_b8 = ZEXT416(*(uint *)(lVar15 + -0x24 + lVar74));
                        local_a8 = ZEXT416(*(uint *)(lVar15 + -0x14 + lVar74));
                        local_e8 = ZEXT416(*(uint *)(lVar15 + -4 + lVar74));
                        pfVar1 = (float *)(lVar15 + -0x20 + lVar74);
                        local_108 = *pfVar1;
                        fStack_104 = pfVar1[1];
                        fStack_c0 = pfVar1[2];
                        fStack_fc = pfVar1[3];
                        pfVar1 = (float *)(lVar15 + -0x10 + lVar74);
                        local_f8 = *pfVar1;
                        fStack_f4 = pfVar1[1];
                        fStack_f0 = pfVar1[2];
                        fStack_ec = pfVar1[3];
                        pfVar1 = (float *)(lVar15 + -0x30 + lVar74);
                        local_88 = *pfVar1;
                        fStack_7c = pfVar1[1];
                        pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x30);
                        fVar79 = *pfVar1;
                        fVar100 = pfVar1[1];
                        fVar122 = pfVar1[2];
                        pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x20);
                        fVar127 = *pfVar1;
                        fVar110 = pfVar1[1];
                        fVar101 = pfVar1[2];
                        puVar6 = (undefined8 *)((long)pAVar14 + lVar74 + -0x10);
                        local_148.p.field_0._0_8_ = *puVar6;
                        local_148.p.field_0._8_8_ = puVar6[1];
                        pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                        fVar104 = *pfVar1;
                        fVar94 = pfVar1[1];
                        fVar106 = pfVar1[2];
                        fVar80 = fVar79 * local_88 + fVar100 * local_108 + fVar122 * local_f8;
                        fVar112 = fVar79 * 0.0 + fVar100 * fStack_104 + fVar122 * fStack_f4;
                        fVar79 = fVar79 * 0.0 + fVar100 * 0.0 + fVar122 * fStack_f0;
                        local_148.l.vz.field_0.m128[0] =
                             fVar127 * local_88 + fVar110 * local_108 + fVar101 * local_f8;
                        local_148.l.vz.field_0.m128[1] =
                             fVar127 * 0.0 + fVar110 * fStack_104 + fVar101 * fStack_f4;
                        local_148.l.vz.field_0.m128[2] =
                             fVar127 * 0.0 + fVar110 * 0.0 + fVar101 * fStack_f0;
                        local_148.l.vz.field_0.m128[3] =
                             fVar127 * fStack_7c + fVar110 * fStack_fc + fVar101 * fStack_ec;
                        fStack_100 = 0.0;
                        fStack_84 = 0.0;
                        fStack_80 = 0.0;
                        pfVar1 = (float *)(lVar15 + lVar74);
                        local_98._0_4_ =
                             fVar104 * local_88 + fVar94 * local_108 + fVar106 * local_f8 + *pfVar1;
                        local_98._4_4_ =
                             fVar104 * 0.0 + fVar94 * fStack_104 + fVar106 * fStack_f4 + pfVar1[1];
                        fStack_90 = fVar104 * 0.0 + fVar94 * 0.0 + fVar106 * fStack_f0 + pfVar1[2];
                        register0x0000128c =
                             fVar104 * fStack_7c + fVar94 * fStack_fc + fVar106 * fStack_ec +
                             pfVar1[3];
                        local_c8 = local_108;
                        fStack_c4 = fStack_104;
                        fStack_bc = fStack_fc;
                        if (((fVar112 != 0.0) || (NAN(fVar112))) ||
                           ((fVar79 != 0.0 ||
                            (((NAN(fVar79) || (local_148.l.vz.field_0.m128[2] != 0.0)) ||
                             (NAN(local_148.l.vz.field_0.m128[2]))))))) {
                          poVar64 = std::operator<<((ostream *)&std::cout,
                                                                                                        
                                                  "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                                  );
                          std::endl<char,std::char_traits<char>>(poVar64);
                          uVar71 = extraout_RDX_14;
                        }
                        fVar79 = local_88 * local_148.p.field_0.m128[0] +
                                 local_108 * local_148.p.field_0.m128[1] +
                                 local_f8 * local_148.p.field_0.m128[2];
                        fVar100 = fStack_84 * local_148.p.field_0.m128[0] +
                                  fStack_104 * local_148.p.field_0.m128[1] +
                                  fStack_f4 * local_148.p.field_0.m128[2];
                        fVar101 = fStack_80 * local_148.p.field_0.m128[0] +
                                  fStack_100 * local_148.p.field_0.m128[1] +
                                  fStack_f0 * local_148.p.field_0.m128[2];
                        local_148.l.vy.field_0._8_1_ = 1;
                        fVar104 = (float)local_e8._0_4_;
                        fVar122 = (float)local_b8._0_4_;
                        fVar94 = (float)local_98._0_4_;
                        fVar106 = (float)local_98._4_4_;
                        fVar112 = fStack_90;
                        fVar105 = (float)local_d8._0_4_;
                        uVar62 = local_148.l.vz.field_0.m128[0];
                        uVar117 = local_148.l.vz.field_0.m128[1];
                        fVar127 = fStack_c0;
                        fVar110 = (float)local_a8._0_4_;
                      }
                      else {
                        if (((local_178 != 0.0) || (NAN(local_178))) ||
                           ((fVar81 != 0.0 ||
                            ((NAN(fVar81) ||
                             (uVar66 = *(undefined8 *)(lVar15 + -0x10 + lVar74),
                             auVar41._4_4_ = -(uint)(*(float *)(lVar15 + -0x20 + lVar74) != 0.0),
                             auVar41._0_4_ = -(uint)(*(float *)(lVar15 + -0x18 + lVar74) != 0.0),
                             auVar41._8_4_ = -(uint)((float)uVar66 != 0.0),
                             auVar41._12_4_ = -(uint)((float)((ulong)uVar66 >> 0x20) != 0.0),
                             uVar62 = movmskps((int)CONCAT71(uVar69,bVar61),auVar41),
                             (char)uVar62 != '\0')))))) {
                          poVar64 = std::operator<<((ostream *)&std::cout,
                                                                                                        
                                                  "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                                  );
                          std::endl<char,std::char_traits<char>>(poVar64);
                          uVar71 = extraout_RDX_13;
                        }
                        pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x30);
                        pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x20);
                        pfVar3 = (float *)((long)pAVar14 + lVar74 + -0x10);
                        fVar79 = *pfVar3;
                        fVar100 = pfVar3[1];
                        pfVar4 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                        fVar80 = *(float *)(lVar15 + -0x30 + lVar74) * *pfVar1;
                        local_178 = pfVar1[1] + (float)*(undefined8 *)(lVar15 + lVar74);
                        fVar81 = pfVar1[2] +
                                 (float)((ulong)*(undefined8 *)(lVar15 + lVar74) >> 0x20);
                        fVar101 = pfVar3[2] * *(float *)(lVar15 + -8 + lVar74);
                        local_148.l.vy.field_0._8_1_ = 1;
                        fVar104 = pfVar3[3];
                        fVar122 = pfVar1[3];
                        fVar94 = *pfVar4;
                        fVar106 = pfVar4[1];
                        fVar112 = pfVar4[2];
                        fVar105 = pfVar4[3];
                        uVar62 = *pfVar2;
                        uVar117 = pfVar2[1] * *(float *)(lVar15 + -0x1c + lVar74);
                        fVar127 = pfVar2[2] + *(float *)(lVar15 + 8 + lVar74);
                        fVar110 = pfVar2[3];
                      }
                    }
                  }
                }
                else {
                  pfVar1 = (float *)(lVar15 + -0x24 + lVar74);
                  auVar10._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar10._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar10._8_4_ = -(uint)(pfVar1[2] != 1.0);
                  auVar10._12_4_ = -(uint)(pfVar1[3] != 0.0);
                  uVar75 = movmskps(uVar75,auVar10);
                  if ((((bVar61 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                     (((uVar75 & 4) != 0 ||
                      (bVar70 = ((byte)uVar75 & 8) >> 3,
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 != 0))))
                  goto LAB_001535f6;
                  pfVar1 = (float *)(lVar15 + -0x14 + lVar74);
                  auVar39._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar39._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar39._8_4_ = -(uint)(pfVar1[2] != 0.0);
                  auVar39._12_4_ = -(uint)(pfVar1[3] != 1.0);
                  uVar75 = movmskps(uVar75,auVar39);
                  if (((((bVar61 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                      ((uVar75 & 4) != 0)) ||
                     (bVar70 = ((byte)uVar75 & 8) >> 3,
                     uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 != 0)) goto LAB_001535f6;
                  pfVar1 = (float *)(lVar15 + -4 + lVar74);
                  auVar40._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar40._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar40._8_4_ = -(uint)(pfVar1[2] != 0.0);
                  auVar40._12_4_ = -(uint)(pfVar1[3] != 0.0);
                  uVar75 = movmskps(uVar75,auVar40);
                  if ((((bVar61 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0)
                     ) goto LAB_001535f6;
                  bVar70 = ((byte)uVar75 & 8) >> 3;
                  uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
                  uVar71 = (ulong)uVar75;
                  if ((bVar70 != 0) ||
                     ((bVar61 != 0 &&
                      ((fVar79 = *(float *)(lVar15 + 0xc + lVar74), fVar79 != 1.0 || (NAN(fVar79))))
                      ))) goto LAB_001535f6;
                  pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x30);
                  fVar80 = *pfVar1;
                  local_178 = pfVar1[1];
                  fVar81 = pfVar1[2];
                  fVar122 = pfVar1[3];
                  pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x20);
                  uVar62 = *pfVar1;
                  uVar117 = pfVar1[1];
                  fVar127 = pfVar1[2];
                  fVar110 = pfVar1[3];
                  pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x10);
                  fVar79 = *pfVar1;
                  fVar100 = pfVar1[1];
                  fVar101 = pfVar1[2];
                  fVar104 = pfVar1[3];
                  pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                  fVar94 = *pfVar1;
                  fVar106 = pfVar1[1];
                  fVar112 = pfVar1[2];
                  fVar105 = pfVar1[3];
                  local_148.l.vy.field_0._8_1_ = bVar11;
                }
LAB_00153d2b:
                pfVar1 = (float *)((long)&((Vector *)(local_148.l.vy.field_0._0_8_ + -0x30))->
                                          field_0 + lVar74);
                *pfVar1 = fVar80;
                pfVar1[1] = local_178;
                pfVar1[2] = fVar81;
                pfVar1[3] = fVar122;
                pfVar1 = (float *)((long)&((Vector *)(local_148.l.vy.field_0._0_8_ + -0x20))->
                                          field_0 + lVar74);
                *pfVar1 = (float)uVar62;
                pfVar1[1] = (float)uVar117;
                pfVar1[2] = fVar127;
                pfVar1[3] = fVar110;
                pfVar1 = (float *)((long)&((Vector *)(local_148.l.vy.field_0._0_8_ + -0x10))->
                                          field_0 + lVar74);
                *pfVar1 = fVar79;
                pfVar1[1] = fVar100;
                pfVar1[2] = fVar101;
                pfVar1[3] = fVar104;
                pfVar1 = (float *)(local_148.l.vy.field_0._0_8_ + lVar74);
                *pfVar1 = fVar94;
                pfVar1[1] = fVar106;
                pfVar1[2] = fVar112;
                pfVar1[3] = fVar105;
                lVar74 = lVar74 + 0x40;
                uVar66 = local_148.l.vy.field_0._0_8_;
              }
            }
          }
          std::
          vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
          ::emplace_back<embree::SceneGraph::Transformations>
                    ((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                      *)local_58,(Transformations *)local_158);
          SceneGraph::Transformations::~Transformations((Transformations *)local_158);
          p_Var73 = (_Base_ptr)((long)&local_38->_M_color + 1);
        }
        convertInstances(local_68,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                   *)local_70,(Ref<embree::SceneGraph::Node> *)(local_40 + 4),
                         (vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                          *)local_58);
        std::
        vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
        ::~vector((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                   *)local_58);
        (**(code **)(*(long *)p_Var60 + 0x18))(p_Var60);
      }
    }
    else {
      auVar139 = (**(code **)(*plVar63 + 0x10))(plVar63);
      uVar71 = auVar139._8_8_;
      sVar13 = (spaces->spaces).size_active;
      if (sVar13 == 1) {
        fVar79 = (spaces->time_range).lower;
        fVar81 = (spaces->time_range).upper;
        fVar100 = (float)plVar63[0xd];
        fVar80 = (float)((ulong)plVar63[0xd] >> 0x20);
        uVar75 = -(uint)(fVar79 < fVar100);
        uVar77 = -(uint)(fVar81 < fVar80);
        local_158._0_8_ =
             CONCAT44(~uVar77 & (uint)fVar80,~uVar75 & (uint)fVar79) |
             CONCAT44((uint)fVar81 & uVar77,(uint)fVar100 & uVar75);
        sVar13 = plVar63[0xf];
        local_148.l.vy.field_0._0_8_ = (void *)0x0;
        local_148.l.vx.field_0._0_8_ = 0;
        local_148.l.vx.field_0._8_8_ = 0;
        if (sVar13 != 0) {
          local_148.l.vy.field_0._0_8_ = alignedMalloc(sVar13 << 6,0x10);
          auVar139._8_8_ = extraout_RDX;
          auVar139._0_8_ = local_148.l.vy.field_0._0_8_;
          local_148.l.vx.field_0._8_8_ = sVar13;
        }
        local_148.l.vy.field_0._8_1_ = 0;
        lVar74 = 0x30;
        local_148.l.vx.field_0._0_8_ = local_148.l.vx.field_0._8_8_;
        for (uVar71 = 0; uVar75 = auVar139._8_4_, uVar71 < (ulong)plVar63[0xf]; uVar71 = uVar71 + 1)
        {
          pAVar14 = (spaces->spaces).items;
          lVar15 = plVar63[0x11];
          bVar11 = spaces->quaternion;
          uVar72 = CONCAT71(auVar139._1_7_,bVar11);
          bVar61 = *(byte *)(plVar63 + 0x12);
          local_148.l.vy.field_0._8_1_ = 0;
          fVar79 = (pAVar14->l).vx.field_0.m128[0];
          uVar66 = *(undefined8 *)((long)&(pAVar14->l).vx.field_0 + 4);
          fVar81 = (float)((ulong)uVar66 >> 0x20);
          local_178 = (float)uVar66;
          if ((((fVar79 != 1.0) || (NAN(fVar79))) || (local_178 != 0.0)) ||
             (((NAN(local_178) || (fVar81 != 0.0)) || (NAN(fVar81))))) {
LAB_001510ea:
            uVar66 = *(undefined8 *)(lVar15 + -0x30 + lVar74);
            fVar100 = (float)uVar66;
            fVar122 = (float)((ulong)uVar66 >> 0x20);
            iVar76 = -(uint)(fVar100 != 1.0);
            iVar78 = -(uint)(fVar122 != 0.0);
            auVar83._4_4_ = iVar78;
            auVar83._0_4_ = iVar76;
            auVar83._8_4_ = iVar78;
            auVar83._12_4_ = iVar78;
            auVar82._8_8_ = auVar83._8_8_;
            auVar82._4_4_ = iVar76;
            auVar82._0_4_ = iVar76;
            uVar75 = movmskpd(uVar75,auVar82);
            fVar79 = *(float *)(lVar15 + -0x28 + lVar74);
            if (((((uVar75 & 1) == 0) && (bVar70 = (byte)uVar75 >> 1, bVar70 == 0)) &&
                (fVar79 == 0.0)) && (!NAN(fVar79))) {
              pfVar1 = (float *)(lVar15 + -0x24 + lVar74);
              auVar42._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar42._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar42._8_4_ = -(uint)(pfVar1[2] != 1.0);
              auVar42._12_4_ = -(uint)(pfVar1[3] != 0.0);
              uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar42);
              if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                 (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                pfVar1 = (float *)(lVar15 + -0x14 + lVar74);
                auVar43._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar43._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar43._8_4_ = -(uint)(pfVar1[2] != 0.0);
                auVar43._12_4_ = -(uint)(pfVar1[3] != 1.0);
                uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar43);
                if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                   (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                  pfVar1 = (float *)(lVar15 + -4 + lVar74);
                  auVar44._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar44._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar44._8_4_ = -(uint)(pfVar1[2] != 0.0);
                  auVar44._12_4_ = -(uint)(pfVar1[3] != 0.0);
                  uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar44);
                  if ((((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                       ((uVar75 & 4) == 0)) &&
                      (bVar70 = ((byte)uVar75 & 8) >> 3,
                      uVar67 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 == 0)) &&
                     ((bVar61 == 0 ||
                      ((fVar80 = *(float *)(lVar15 + 0xc + lVar74), fVar80 == 1.0 && (!NAN(fVar80)))
                      )))) {
                    fVar80 = (pAVar14->l).vx.field_0.m128[0];
                    local_178 = (pAVar14->l).vx.field_0.m128[1];
                    fVar81 = (pAVar14->l).vx.field_0.m128[2];
                    fVar122 = (pAVar14->l).vx.field_0.m128[3];
                    uVar62 = (pAVar14->l).vy.field_0.m128[0];
                    uVar117 = (pAVar14->l).vy.field_0.m128[1];
                    fVar127 = (pAVar14->l).vy.field_0.m128[2];
                    fVar110 = (pAVar14->l).vy.field_0.m128[3];
                    fVar79 = (pAVar14->l).vz.field_0.m128[0];
                    fVar100 = (pAVar14->l).vz.field_0.m128[1];
                    fVar101 = (pAVar14->l).vz.field_0.m128[2];
                    fVar104 = (pAVar14->l).vz.field_0.m128[3];
                    fVar94 = (pAVar14->p).field_0.m128[0];
                    fVar106 = (pAVar14->p).field_0.m128[1];
                    fVar112 = (pAVar14->p).field_0.m128[2];
                    fVar105 = (pAVar14->p).field_0.m128[3];
                    local_148.l.vy.field_0._8_1_ = bVar11;
                    goto LAB_00151806;
                  }
                }
              }
            }
            uVar67 = uVar72 & 0xffffffff;
            bVar70 = (byte)uVar67 | bVar61;
            uVar67 = CONCAT71((int7)(uVar67 >> 8),bVar70);
            if (bVar70 == 0) {
              fVar112 = (pAVar14->l).vx.field_0.m128[0];
              fVar125 = (pAVar14->l).vx.field_0.m128[1];
              fVar126 = (pAVar14->l).vx.field_0.m128[2];
              fVar128 = (pAVar14->l).vx.field_0.m128[3];
              fVar134 = (pAVar14->l).vy.field_0.m128[0];
              fVar137 = (pAVar14->l).vy.field_0.m128[1];
              fVar95 = (pAVar14->l).vy.field_0.m128[2];
              fVar96 = (pAVar14->l).vy.field_0.m128[3];
              fVar97 = (pAVar14->l).vz.field_0.m128[0];
              fVar130 = (pAVar14->l).vz.field_0.m128[1];
              fVar98 = (pAVar14->l).vz.field_0.m128[2];
              fVar99 = (pAVar14->l).vz.field_0.m128[3];
              fVar80 = fVar100 * fVar112 + fVar122 * fVar134 + fVar79 * fVar97;
              local_178 = fVar100 * fVar125 + fVar122 * fVar137 + fVar79 * fVar130;
              fVar81 = fVar100 * fVar126 + fVar122 * fVar95 + fVar79 * fVar98;
              fVar122 = fVar100 * fVar128 + fVar122 * fVar96 + fVar79 * fVar99;
              fVar79 = *(float *)(lVar15 + -0x20 + lVar74);
              fVar100 = *(float *)(lVar15 + -0x1c + lVar74);
              fVar110 = *(float *)(lVar15 + -0x18 + lVar74);
              fVar104 = *(float *)(lVar15 + -0x10 + lVar74);
              uVar62 = fVar79 * fVar112 + fVar100 * fVar134 + fVar110 * fVar97;
              uVar117 = fVar79 * fVar125 + fVar100 * fVar137 + fVar110 * fVar130;
              fVar127 = fVar79 * fVar126 + fVar100 * fVar95 + fVar110 * fVar98;
              fVar110 = fVar79 * fVar128 + fVar100 * fVar96 + fVar110 * fVar99;
              fVar94 = *(float *)(lVar15 + -0xc + lVar74);
              fVar106 = *(float *)(lVar15 + -8 + lVar74);
              fVar79 = fVar104 * fVar112 + fVar94 * fVar134 + fVar106 * fVar97;
              fVar100 = fVar104 * fVar125 + fVar94 * fVar137 + fVar106 * fVar130;
              fVar101 = fVar104 * fVar126 + fVar94 * fVar95 + fVar106 * fVar98;
              fVar104 = fVar104 * fVar128 + fVar94 * fVar96 + fVar106 * fVar99;
              fVar105 = *(float *)(lVar15 + lVar74);
              fVar7 = *(float *)(lVar15 + 4 + lVar74);
              fVar8 = *(float *)(lVar15 + 8 + lVar74);
              fVar94 = fVar105 * fVar112 + fVar7 * fVar134 + fVar8 * fVar97 +
                       (pAVar14->p).field_0.m128[0];
              fVar106 = fVar105 * fVar125 + fVar7 * fVar137 + fVar8 * fVar130 +
                        (pAVar14->p).field_0.m128[1];
              fVar112 = fVar105 * fVar126 + fVar7 * fVar95 + fVar8 * fVar98 +
                        (pAVar14->p).field_0.m128[2];
              fVar105 = fVar105 * fVar128 + fVar7 * fVar96 + fVar8 * fVar99 +
                        (pAVar14->p).field_0.m128[3];
            }
            else {
              uVar72 = uVar72 & 0xffffffff;
              bVar70 = (byte)uVar72 & bVar61;
              uVar67 = CONCAT71((int7)(uVar72 >> 8),bVar70);
              if (bVar70 == 1) {
                poVar64 = std::operator<<((ostream *)&std::cout,
                                          "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                         );
                std::endl<char,std::char_traits<char>>(poVar64);
                fVar79 = (pAVar14->p).field_0.m128[3];
                fVar81 = (pAVar14->l).vx.field_0.m128[3];
                fVar100 = (pAVar14->l).vy.field_0.m128[3];
                fVar80 = (pAVar14->l).vz.field_0.m128[3];
                aVar9 = (pAVar14->l).vx.field_0.field_1;
                fVar122 = (pAVar14->l).vy.field_0.m128[0];
                fVar127 = (pAVar14->l).vy.field_0.m128[1];
                fVar110 = (pAVar14->l).vz.field_0.m128[0];
                fVar101 = (pAVar14->l).vz.field_0.m128[1];
                fVar104 = (pAVar14->l).vz.field_0.m128[2];
                fVar128 = fVar81 * fVar100 + fVar79 * fVar80;
                fVar106 = fVar81 * fVar100 - fVar79 * fVar80;
                fVar112 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar100 * fVar100 + -fVar80 * fVar80;
                fVar125 = fVar79 * fVar79 - fVar81 * fVar81;
                fVar126 = fVar100 * fVar100 + fVar125 + -fVar80 * fVar80;
                fVar137 = fVar81 * fVar80 - fVar79 * fVar100;
                fVar94 = fVar79 * fVar100 + fVar81 * fVar80;
                fVar134 = fVar100 * fVar80 + fVar79 * fVar81;
                fVar79 = fVar100 * fVar80 - fVar79 * fVar81;
                fVar105 = (pAVar14->p).field_0.m128[0];
                fVar7 = (pAVar14->p).field_0.m128[1];
                fVar8 = (pAVar14->p).field_0.m128[2];
                fVar128 = fVar128 + fVar128;
                fVar137 = fVar137 + fVar137;
                fVar106 = fVar106 + fVar106;
                fVar134 = fVar134 + fVar134;
                fVar94 = fVar94 + fVar94;
                fVar79 = fVar79 + fVar79;
                fVar81 = fVar80 * fVar80 + fVar125 + -fVar100 * fVar100;
                fVar113 = fVar112 * 1.0 + fVar128 * 0.0 + fVar137 * 0.0;
                fVar115 = fVar112 * 0.0 + fVar128 * 1.0 + fVar137 * 0.0;
                fVar118 = fVar112 * 0.0 + fVar128 * 0.0 + fVar137 * 1.0;
                fVar120 = fVar112 * 0.0 + fVar128 * 0.0 + fVar137 * 0.0;
                fVar107 = fVar106 * 1.0 + fVar126 * 0.0 + fVar134 * 0.0;
                fVar108 = fVar106 * 0.0 + fVar126 * 1.0 + fVar134 * 0.0;
                fVar109 = fVar106 * 0.0 + fVar126 * 0.0 + fVar134 * 1.0;
                fVar111 = fVar106 * 0.0 + fVar126 * 0.0 + fVar134 * 0.0;
                fVar106 = fVar94 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                fVar112 = fVar94 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                fVar128 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                fVar137 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                local_168 = aVar9.y;
                fStack_164 = aVar9.z;
                local_178 = aVar9.x;
                fVar129 = local_178 * fVar113 + fVar107 * 0.0 + fVar106 * 0.0;
                fVar131 = local_178 * fVar115 + fVar108 * 0.0 + fVar112 * 0.0;
                fVar132 = local_178 * fVar118 + fVar109 * 0.0 + fVar128 * 0.0;
                fVar133 = local_178 * fVar120 + fVar111 * 0.0 + fVar137 * 0.0;
                fVar125 = fVar122 * fVar113 + fVar127 * fVar107 + fVar106 * 0.0;
                fVar126 = fVar122 * fVar115 + fVar127 * fVar108 + fVar112 * 0.0;
                fVar134 = fVar122 * fVar118 + fVar127 * fVar109 + fVar128 * 0.0;
                fVar95 = fVar122 * fVar120 + fVar127 * fVar111 + fVar137 * 0.0;
                local_148.l.vz.field_0.m128[0] =
                     fVar110 * fVar113 + fVar101 * fVar107 + fVar104 * fVar106;
                local_148.l.vz.field_0.m128[1] =
                     fVar110 * fVar115 + fVar101 * fVar108 + fVar104 * fVar112;
                local_148.l.vz.field_0.m128[2] =
                     fVar110 * fVar118 + fVar101 * fVar109 + fVar104 * fVar128;
                local_148.l.vz.field_0.m128[3] =
                     fVar110 * fVar120 + fVar101 * fVar111 + fVar104 * fVar137;
                fVar79 = *(float *)(lVar15 + 0xc + lVar74);
                fVar81 = *(float *)(lVar15 + -0x24 + lVar74);
                fVar100 = *(float *)(lVar15 + -0x14 + lVar74);
                fVar80 = *(float *)(lVar15 + -4 + lVar74);
                fVar130 = fVar81 * fVar100 + fVar79 * fVar80;
                fVar96 = fVar81 * fVar100 - fVar79 * fVar80;
                fVar97 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar100 * fVar100 + -fVar80 * fVar80;
                fVar127 = fVar79 * fVar79 - fVar81 * fVar81;
                fVar136 = fVar100 * fVar100 + fVar127 + -fVar80 * fVar80;
                fVar135 = fVar81 * fVar80 - fVar79 * fVar100;
                fVar102 = fVar79 * fVar100 + fVar81 * fVar80;
                fVar138 = fVar100 * fVar80 + fVar79 * fVar81;
                fVar94 = fVar100 * fVar80 - fVar79 * fVar81;
                pfVar2 = (float *)(lVar15 + -0x30 + lVar74);
                fVar79 = *pfVar2;
                pfVar3 = (float *)(lVar15 + -0x20 + lVar74);
                fVar81 = *pfVar3;
                fVar122 = pfVar3[1];
                fVar121 = fVar80 * fVar80 + fVar127 + -fVar100 * fVar100;
                pfVar1 = (float *)(lVar15 + -0x10 + lVar74);
                fVar100 = *pfVar1;
                fVar80 = pfVar1[1];
                fVar127 = pfVar1[2];
                fVar130 = fVar130 + fVar130;
                fVar135 = fVar135 + fVar135;
                pfVar1 = (float *)(lVar15 + lVar74);
                fVar110 = *pfVar1;
                fVar101 = pfVar1[1];
                fVar104 = pfVar1[2];
                fVar98 = fVar97 * 1.0 + fVar130 * 0.0 + fVar135 * 0.0;
                fVar99 = fVar97 * 0.0 + fVar130 * 1.0 + fVar135 * 0.0;
                fVar135 = fVar97 * 0.0 + fVar130 * 0.0 + fVar135 * 1.0;
                fVar96 = fVar96 + fVar96;
                fVar138 = fVar138 + fVar138;
                fVar102 = fVar102 + fVar102;
                fVar94 = fVar94 + fVar94;
                fVar97 = fVar96 * 1.0 + fVar136 * 0.0 + fVar138 * 0.0;
                fVar130 = fVar96 * 0.0 + fVar136 * 1.0 + fVar138 * 0.0;
                fVar96 = fVar96 * 0.0 + fVar136 * 0.0 + fVar138 * 1.0;
                fVar136 = fVar102 * 1.0 + fVar94 * 0.0 + fVar121 * 0.0;
                fVar138 = fVar102 * 0.0 + fVar94 * 1.0 + fVar121 * 0.0;
                fVar94 = fVar102 * 0.0 + fVar94 * 0.0 + fVar121 * 1.0;
                fVar114 = fVar79 * fVar98 + fVar97 * 0.0 + fVar136 * 0.0;
                fVar116 = fVar79 * fVar99 + fVar130 * 0.0 + fVar138 * 0.0;
                fVar119 = fVar79 * fVar135 + fVar96 * 0.0 + fVar94 * 0.0;
                fVar102 = fVar81 * fVar98 + fVar122 * fVar97 + fVar136 * 0.0;
                fVar121 = fVar81 * fVar99 + fVar122 * fVar130 + fVar138 * 0.0;
                fVar103 = fVar81 * fVar135 + fVar122 * fVar96 + fVar94 * 0.0;
                fVar122 = fVar100 * fVar98 + fVar80 * fVar97 + fVar127 * fVar136;
                fVar123 = fVar100 * fVar99 + fVar80 * fVar130 + fVar127 * fVar138;
                fVar124 = fVar100 * fVar135 + fVar80 * fVar96 + fVar127 * fVar94;
                fVar127 = fVar110 * fVar98 + fVar101 * fVar97 + fVar104 * fVar136 + pfVar2[1] + 0.0;
                fVar97 = fVar110 * fVar99 + fVar101 * fVar130 + fVar104 * fVar138 + pfVar2[2] + 0.0;
                fVar110 = fVar110 * fVar135 + fVar101 * fVar96 + fVar104 * fVar94 + pfVar3[2] + 0.0;
                fVar80 = fVar114 * fVar129 +
                         fVar116 * fVar125 + fVar119 * local_148.l.vz.field_0.m128[0];
                local_178 = fVar114 * fVar131 +
                            fVar116 * fVar126 + fVar119 * local_148.l.vz.field_0.m128[1];
                fVar81 = fVar114 * fVar132 +
                         fVar116 * fVar134 + fVar119 * local_148.l.vz.field_0.m128[2];
                fVar79 = fVar122 * fVar129 +
                         fVar123 * fVar125 + fVar124 * local_148.l.vz.field_0.m128[0];
                fVar100 = fVar122 * fVar131 +
                          fVar123 * fVar126 + fVar124 * local_148.l.vz.field_0.m128[1];
                fVar101 = fVar122 * fVar132 +
                          fVar123 * fVar134 + fVar124 * local_148.l.vz.field_0.m128[2];
                uVar67 = extraout_RDX_00;
                fVar104 = fVar122 * fVar133 +
                          fVar123 * fVar95 + fVar124 * local_148.l.vz.field_0.m128[3];
                fVar122 = fVar114 * fVar133 +
                          fVar116 * fVar95 + fVar119 * local_148.l.vz.field_0.m128[3];
                fVar94 = fVar127 * fVar129 +
                         fVar97 * fVar125 + fVar110 * local_148.l.vz.field_0.m128[0] +
                         fVar105 * fVar113 + fVar7 * fVar107 + fVar8 * fVar106 + local_168 + 0.0;
                fVar106 = fVar127 * fVar131 +
                          fVar97 * fVar126 + fVar110 * local_148.l.vz.field_0.m128[1] +
                          fVar105 * fVar115 + fVar7 * fVar108 + fVar8 * fVar112 + fStack_164 + 0.0;
                fVar112 = fVar127 * fVar132 +
                          fVar97 * fVar134 + fVar110 * local_148.l.vz.field_0.m128[2] +
                          fVar105 * fVar118 + fVar7 * fVar109 + fVar8 * fVar128 +
                          (pAVar14->l).vy.field_0.m128[2] + 0.0;
                fVar105 = fVar127 * fVar133 +
                          fVar97 * fVar95 + fVar110 * local_148.l.vz.field_0.m128[3] +
                          fVar105 * fVar120 + fVar7 * fVar111 + fVar8 * fVar137 + 0.0;
                uVar62 = fVar102 * fVar129 +
                         fVar121 * fVar125 + fVar103 * local_148.l.vz.field_0.m128[0];
                uVar117 = fVar102 * fVar131 +
                          fVar121 * fVar126 + fVar103 * local_148.l.vz.field_0.m128[1];
                fVar127 = fVar102 * fVar132 +
                          fVar121 * fVar134 + fVar103 * local_148.l.vz.field_0.m128[2];
                fVar110 = fVar102 * fVar133 +
                          fVar121 * fVar95 + fVar103 * local_148.l.vz.field_0.m128[3];
              }
              else {
                bVar61 = bVar11 ^ 1U | bVar61;
                if (bVar61 == 0) {
                  local_d8 = ZEXT416((uint)(pAVar14->p).field_0.m128[3]);
                  local_b8 = ZEXT416((uint)(pAVar14->l).vx.field_0.m128[3]);
                  local_a8 = ZEXT416((uint)(pAVar14->l).vy.field_0.m128[3]);
                  local_e8 = ZEXT416((uint)(pAVar14->l).vz.field_0.m128[3]);
                  local_108 = (pAVar14->l).vy.field_0.m128[0];
                  fStack_104 = (pAVar14->l).vy.field_0.m128[1];
                  fStack_c0 = (pAVar14->l).vy.field_0.m128[2];
                  fStack_fc = (pAVar14->l).vy.field_0.m128[3];
                  local_f8 = (pAVar14->l).vz.field_0.m128[0];
                  fStack_f4 = (pAVar14->l).vz.field_0.m128[1];
                  fStack_f0 = (pAVar14->l).vz.field_0.m128[2];
                  fStack_ec = (pAVar14->l).vz.field_0.m128[3];
                  local_88 = (pAVar14->l).vx.field_0.m128[0];
                  fStack_7c = (pAVar14->l).vx.field_0.m128[1];
                  pfVar1 = (float *)(lVar15 + -0x30 + lVar74);
                  fVar79 = *pfVar1;
                  fVar100 = pfVar1[1];
                  fVar122 = pfVar1[2];
                  pfVar1 = (float *)(lVar15 + -0x20 + lVar74);
                  fVar127 = *pfVar1;
                  fVar110 = pfVar1[1];
                  fVar101 = pfVar1[2];
                  puVar5 = (undefined8 *)(lVar15 + -0x10 + lVar74);
                  local_148.p.field_0._0_8_ = *puVar5;
                  local_148.p.field_0._8_8_ = puVar5[1];
                  pfVar1 = (float *)(lVar15 + lVar74);
                  fVar104 = *pfVar1;
                  fVar94 = pfVar1[1];
                  fVar106 = pfVar1[2];
                  fVar80 = fVar79 * local_88 + fVar100 * local_108 + fVar122 * local_f8;
                  fVar112 = fVar79 * 0.0 + fVar100 * fStack_104 + fVar122 * fStack_f4;
                  fVar79 = fVar79 * 0.0 + fVar100 * 0.0 + fVar122 * fStack_f0;
                  local_148.l.vz.field_0.m128[0] =
                       fVar127 * local_88 + fVar110 * local_108 + fVar101 * local_f8;
                  local_148.l.vz.field_0.m128[1] =
                       fVar127 * 0.0 + fVar110 * fStack_104 + fVar101 * fStack_f4;
                  local_148.l.vz.field_0.m128[2] =
                       fVar127 * 0.0 + fVar110 * 0.0 + fVar101 * fStack_f0;
                  local_148.l.vz.field_0.m128[3] =
                       fVar127 * fStack_7c + fVar110 * fStack_fc + fVar101 * fStack_ec;
                  fStack_100 = 0.0;
                  fStack_84 = 0.0;
                  fStack_80 = 0.0;
                  local_98._0_4_ =
                       fVar104 * local_88 + fVar94 * local_108 + fVar106 * local_f8 +
                       (pAVar14->p).field_0.m128[0];
                  local_98._4_4_ =
                       fVar104 * 0.0 + fVar94 * fStack_104 + fVar106 * fStack_f4 +
                       (pAVar14->p).field_0.m128[1];
                  fStack_90 = fVar104 * 0.0 + fVar94 * 0.0 + fVar106 * fStack_f0 +
                              (pAVar14->p).field_0.m128[2];
                  register0x0000128c =
                       fVar104 * fStack_7c + fVar94 * fStack_fc + fVar106 * fStack_ec +
                       (pAVar14->p).field_0.m128[3];
                  local_c8 = local_108;
                  fStack_c4 = fStack_104;
                  fStack_bc = fStack_fc;
                  if (((fVar112 != 0.0) || (NAN(fVar112))) ||
                     ((fVar79 != 0.0 ||
                      (((NAN(fVar79) || (local_148.l.vz.field_0.m128[2] != 0.0)) ||
                       (NAN(local_148.l.vz.field_0.m128[2]))))))) {
                    poVar64 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar64);
                    uVar67 = extraout_RDX_02;
                  }
                  fVar79 = local_88 * local_148.p.field_0.m128[0] +
                           local_108 * local_148.p.field_0.m128[1] +
                           local_f8 * local_148.p.field_0.m128[2];
                  fVar100 = fStack_84 * local_148.p.field_0.m128[0] +
                            fStack_104 * local_148.p.field_0.m128[1] +
                            fStack_f4 * local_148.p.field_0.m128[2];
                  fVar101 = fStack_80 * local_148.p.field_0.m128[0] +
                            fStack_100 * local_148.p.field_0.m128[1] +
                            fStack_f0 * local_148.p.field_0.m128[2];
                  local_148.l.vy.field_0._8_1_ = 1;
                  fVar104 = (float)local_e8._0_4_;
                  fVar122 = (float)local_b8._0_4_;
                  fVar94 = (float)local_98._0_4_;
                  fVar106 = (float)local_98._4_4_;
                  fVar112 = fStack_90;
                  fVar105 = (float)local_d8._0_4_;
                  uVar62 = local_148.l.vz.field_0.m128[0];
                  uVar117 = local_148.l.vz.field_0.m128[1];
                  fVar127 = fStack_c0;
                  fVar110 = (float)local_a8._0_4_;
                }
                else {
                  if (((local_178 != 0.0) || (NAN(local_178))) ||
                     ((fVar81 != 0.0 ||
                      ((NAN(fVar81) ||
                       (uVar66 = *(undefined8 *)&(pAVar14->l).vz.field_0,
                       auVar22._4_4_ = -(uint)((pAVar14->l).vy.field_0.m128[0] != 0.0),
                       auVar22._0_4_ = -(uint)((pAVar14->l).vy.field_0.m128[2] != 0.0),
                       auVar22._8_4_ = -(uint)((float)uVar66 != 0.0),
                       auVar22._12_4_ = -(uint)((float)((ulong)uVar66 >> 0x20) != 0.0),
                       uVar62 = movmskps((int)CONCAT71(auVar139._1_7_,bVar61),auVar22),
                       (char)uVar62 != '\0')))))) {
                    poVar64 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar64);
                    uVar67 = extraout_RDX_01;
                  }
                  pfVar2 = (float *)(lVar15 + -0x30 + lVar74);
                  pfVar3 = (float *)(lVar15 + -0x20 + lVar74);
                  pfVar4 = (float *)(lVar15 + -0x10 + lVar74);
                  fVar79 = *pfVar4;
                  fVar100 = pfVar4[1];
                  pfVar1 = (float *)(lVar15 + lVar74);
                  uVar66 = *(undefined8 *)&(pAVar14->p).field_0;
                  fVar80 = (pAVar14->l).vx.field_0.m128[0] * *pfVar2;
                  local_178 = pfVar2[1] + (float)uVar66;
                  fVar81 = pfVar2[2] + (float)((ulong)uVar66 >> 0x20);
                  fVar101 = pfVar4[2] * (pAVar14->l).vz.field_0.m128[2];
                  local_148.l.vy.field_0._8_1_ = 1;
                  fVar104 = pfVar4[3];
                  fVar122 = pfVar2[3];
                  fVar94 = *pfVar1;
                  fVar106 = pfVar1[1];
                  fVar112 = pfVar1[2];
                  fVar105 = pfVar1[3];
                  uVar62 = *pfVar3;
                  uVar117 = pfVar3[1] * (pAVar14->l).vy.field_0.m128[1];
                  fVar127 = pfVar3[2] + (pAVar14->p).field_0.m128[2];
                  fVar110 = pfVar3[3];
                }
              }
            }
          }
          else {
            auVar19._4_4_ = -(uint)((pAVar14->l).vy.field_0.m128[0] != 0.0);
            auVar19._0_4_ = -(uint)((pAVar14->l).vx.field_0.m128[3] != 0.0);
            auVar19._8_4_ = -(uint)((pAVar14->l).vy.field_0.m128[1] != 1.0);
            auVar19._12_4_ = -(uint)((pAVar14->l).vy.field_0.m128[2] != 0.0);
            uVar75 = movmskps(uVar75,auVar19);
            if ((((bVar11 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
               (((uVar75 & 4) != 0 ||
                (bVar70 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70),
                bVar70 != 0)))) goto LAB_001510ea;
            auVar20._4_4_ = -(uint)((pAVar14->l).vz.field_0.m128[0] != 0.0);
            auVar20._0_4_ = -(uint)((pAVar14->l).vy.field_0.m128[3] != 0.0);
            auVar20._8_4_ = -(uint)((pAVar14->l).vz.field_0.m128[1] != 0.0);
            auVar20._12_4_ = -(uint)((pAVar14->l).vz.field_0.m128[2] != 1.0);
            uVar75 = movmskps(uVar75,auVar20);
            if (((((bVar11 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0)) ||
               (bVar70 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70),
               bVar70 != 0)) goto LAB_001510ea;
            auVar21._4_4_ = -(uint)((pAVar14->p).field_0.m128[0] != 0.0);
            auVar21._0_4_ = -(uint)((pAVar14->l).vz.field_0.m128[3] != 0.0);
            auVar21._8_4_ = -(uint)((pAVar14->p).field_0.m128[1] != 0.0);
            auVar21._12_4_ = -(uint)((pAVar14->p).field_0.m128[2] != 0.0);
            uVar75 = movmskps(uVar75,auVar21);
            if ((((bVar11 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0))
            goto LAB_001510ea;
            bVar70 = ((byte)uVar75 & 8) >> 3;
            uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
            uVar67 = (ulong)uVar75;
            if ((bVar70 != 0) ||
               ((bVar11 != false &&
                ((fVar79 = (pAVar14->p).field_0.m128[3], fVar79 != 1.0 || (NAN(fVar79)))))))
            goto LAB_001510ea;
            pfVar1 = (float *)(lVar15 + -0x30 + lVar74);
            fVar80 = *pfVar1;
            local_178 = pfVar1[1];
            fVar81 = pfVar1[2];
            fVar122 = pfVar1[3];
            pfVar1 = (float *)(lVar15 + -0x20 + lVar74);
            uVar62 = *pfVar1;
            uVar117 = pfVar1[1];
            fVar127 = pfVar1[2];
            fVar110 = pfVar1[3];
            pfVar1 = (float *)(lVar15 + -0x10 + lVar74);
            fVar79 = *pfVar1;
            fVar100 = pfVar1[1];
            fVar101 = pfVar1[2];
            fVar104 = pfVar1[3];
            pfVar1 = (float *)(lVar15 + lVar74);
            fVar94 = *pfVar1;
            fVar106 = pfVar1[1];
            fVar112 = pfVar1[2];
            fVar105 = pfVar1[3];
            local_148.l.vy.field_0._8_1_ = bVar61;
          }
LAB_00151806:
          auVar139._8_8_ = uVar67;
          auVar139._0_8_ = local_148.l.vy.field_0._0_8_;
          pfVar1 = (float *)(local_148.l.vy.field_0._0_8_ + -0x30 + lVar74);
          *pfVar1 = fVar80;
          pfVar1[1] = local_178;
          pfVar1[2] = fVar81;
          pfVar1[3] = fVar122;
          pfVar1 = (float *)(local_148.l.vy.field_0._0_8_ + -0x20 + lVar74);
          *pfVar1 = (float)uVar62;
          pfVar1[1] = (float)uVar117;
          pfVar1[2] = fVar127;
          pfVar1[3] = fVar110;
          pfVar1 = (float *)(local_148.l.vy.field_0._0_8_ + -0x10 + lVar74);
          *pfVar1 = fVar79;
          pfVar1[1] = fVar100;
          pfVar1[2] = fVar101;
          pfVar1[3] = fVar104;
          pfVar1 = (float *)(local_148.l.vy.field_0._0_8_ + lVar74);
          *pfVar1 = fVar94;
          pfVar1[1] = fVar106;
          pfVar1[2] = fVar112;
          pfVar1[3] = fVar105;
          lVar74 = lVar74 + 0x40;
        }
      }
      else if (plVar63[0xf] == 1) {
        fVar79 = (spaces->time_range).lower;
        fVar81 = (spaces->time_range).upper;
        fVar100 = (float)plVar63[0xd];
        fVar80 = (float)((ulong)plVar63[0xd] >> 0x20);
        uVar75 = -(uint)(fVar79 < fVar100);
        uVar77 = -(uint)(fVar81 < fVar80);
        local_158._0_8_ =
             CONCAT44(~uVar77 & (uint)fVar80,~uVar75 & (uint)fVar79) |
             CONCAT44((uint)fVar81 & uVar77,(uint)fVar100 & uVar75);
        local_148.l.vy.field_0._0_8_ = (void *)0x0;
        local_148.l.vx.field_0._0_8_ = 0;
        local_148.l.vx.field_0._8_8_ = 0;
        if (sVar13 != 0) {
          local_148.l.vy.field_0._0_8_ = alignedMalloc(sVar13 << 6,0x10);
          uVar71 = extraout_RDX_15;
          local_148.l.vx.field_0._8_8_ = sVar13;
        }
        if (spaces->quaternion == false) {
          uVar66 = ZEXT48(*(uint *)(plVar63 + 0x12));
        }
        else {
          uVar66 = (void *)0x1;
        }
        local_148.l.vy.field_0._8_1_ = (undefined1)uVar66;
        lVar74 = 0x30;
        local_148.l.vx.field_0._0_8_ = local_148.l.vx.field_0._8_8_;
        for (uVar72 = 0; uVar75 = (uint)uVar71, uVar72 < (spaces->spaces).size_active;
            uVar72 = uVar72 + 1) {
          pAVar14 = (spaces->spaces).items;
          pfVar1 = (float *)plVar63[0x11];
          bVar11 = spaces->quaternion;
          uVar69 = (undefined7)((ulong)uVar66 >> 8);
          uVar67 = CONCAT71(uVar69,bVar11);
          bVar61 = *(byte *)(plVar63 + 0x12);
          local_148.l.vy.field_0._8_1_ = 0;
          fVar79 = *(float *)((long)pAVar14 + lVar74 + -0x30);
          uVar66 = *(undefined8 *)((long)pAVar14 + lVar74 + -0x2c);
          fVar81 = (float)((ulong)uVar66 >> 0x20);
          local_178 = (float)uVar66;
          if (((((fVar79 != 1.0) || (NAN(fVar79))) || (local_178 != 0.0)) ||
              ((NAN(local_178) || (fVar81 != 0.0)))) || (NAN(fVar81))) {
LAB_001543dc:
            fVar100 = (float)*(undefined8 *)pfVar1;
            fVar122 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
            iVar76 = -(uint)(fVar100 != 1.0);
            iVar78 = -(uint)(fVar122 != 0.0);
            auVar91._4_4_ = iVar78;
            auVar91._0_4_ = iVar76;
            auVar91._8_4_ = iVar78;
            auVar91._12_4_ = iVar78;
            auVar90._8_8_ = auVar91._8_8_;
            auVar90._4_4_ = iVar76;
            auVar90._0_4_ = iVar76;
            uVar75 = movmskpd(uVar75,auVar90);
            fVar79 = pfVar1[2];
            if (((((uVar75 & 1) == 0) && (bVar70 = (byte)uVar75 >> 1, bVar70 == 0)) &&
                (fVar79 == 0.0)) && (!NAN(fVar79))) {
              auVar45._4_4_ = -(uint)(pfVar1[4] != 0.0);
              auVar45._0_4_ = -(uint)(pfVar1[3] != 0.0);
              auVar45._8_4_ = -(uint)(pfVar1[5] != 1.0);
              auVar45._12_4_ = -(uint)(pfVar1[6] != 0.0);
              uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar45);
              if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                 (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                auVar46._4_4_ = -(uint)(pfVar1[8] != 0.0);
                auVar46._0_4_ = -(uint)(pfVar1[7] != 0.0);
                auVar46._8_4_ = -(uint)(pfVar1[9] != 0.0);
                auVar46._12_4_ = -(uint)(pfVar1[10] != 1.0);
                uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar46);
                if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                   (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                  auVar47._4_4_ = -(uint)(pfVar1[0xc] != 0.0);
                  auVar47._0_4_ = -(uint)(pfVar1[0xb] != 0.0);
                  auVar47._8_4_ = -(uint)(pfVar1[0xd] != 0.0);
                  auVar47._12_4_ = -(uint)(pfVar1[0xe] != 0.0);
                  uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar47);
                  if ((((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                       ((uVar75 & 4) == 0)) &&
                      (bVar70 = ((byte)uVar75 & 8) >> 3,
                      uVar71 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 == 0)) &&
                     ((bVar61 == 0 || ((pfVar1[0xf] == 1.0 && (!NAN(pfVar1[0xf]))))))) {
                    pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x30);
                    fVar80 = *pfVar1;
                    local_178 = pfVar1[1];
                    fVar81 = pfVar1[2];
                    fVar122 = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x20);
                    uVar62 = *pfVar1;
                    uVar117 = pfVar1[1];
                    fVar127 = pfVar1[2];
                    fVar110 = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x10);
                    fVar79 = *pfVar1;
                    fVar100 = pfVar1[1];
                    fVar101 = pfVar1[2];
                    fVar104 = pfVar1[3];
                    pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                    fVar94 = *pfVar1;
                    fVar106 = pfVar1[1];
                    fVar112 = pfVar1[2];
                    fVar105 = pfVar1[3];
                    local_148.l.vy.field_0._8_1_ = bVar11;
                    goto LAB_00154af6;
                  }
                }
              }
            }
            uVar71 = uVar67 & 0xffffffff;
            bVar70 = (byte)uVar71 | bVar61;
            uVar71 = CONCAT71((int7)(uVar71 >> 8),bVar70);
            if (bVar70 == 0) {
              pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x30);
              fVar112 = *pfVar2;
              fVar125 = pfVar2[1];
              fVar126 = pfVar2[2];
              fVar128 = pfVar2[3];
              pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x20);
              fVar134 = *pfVar2;
              fVar137 = pfVar2[1];
              fVar95 = pfVar2[2];
              fVar96 = pfVar2[3];
              pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x10);
              fVar97 = *pfVar2;
              fVar130 = pfVar2[1];
              fVar98 = pfVar2[2];
              fVar99 = pfVar2[3];
              fVar80 = fVar100 * fVar112 + fVar122 * fVar134 + fVar79 * fVar97;
              local_178 = fVar100 * fVar125 + fVar122 * fVar137 + fVar79 * fVar130;
              fVar81 = fVar100 * fVar126 + fVar122 * fVar95 + fVar79 * fVar98;
              fVar122 = fVar100 * fVar128 + fVar122 * fVar96 + fVar79 * fVar99;
              fVar79 = pfVar1[4];
              fVar100 = pfVar1[5];
              fVar110 = pfVar1[6];
              fVar104 = pfVar1[8];
              uVar62 = fVar79 * fVar112 + fVar100 * fVar134 + fVar110 * fVar97;
              uVar117 = fVar79 * fVar125 + fVar100 * fVar137 + fVar110 * fVar130;
              fVar127 = fVar79 * fVar126 + fVar100 * fVar95 + fVar110 * fVar98;
              fVar110 = fVar79 * fVar128 + fVar100 * fVar96 + fVar110 * fVar99;
              fVar94 = pfVar1[9];
              fVar106 = pfVar1[10];
              fVar79 = fVar104 * fVar112 + fVar94 * fVar134 + fVar106 * fVar97;
              fVar100 = fVar104 * fVar125 + fVar94 * fVar137 + fVar106 * fVar130;
              fVar101 = fVar104 * fVar126 + fVar94 * fVar95 + fVar106 * fVar98;
              fVar104 = fVar104 * fVar128 + fVar94 * fVar96 + fVar106 * fVar99;
              fVar105 = pfVar1[0xc];
              fVar7 = pfVar1[0xd];
              fVar8 = pfVar1[0xe];
              pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
              fVar94 = fVar105 * fVar112 + fVar7 * fVar134 + fVar8 * fVar97 + *pfVar1;
              fVar106 = fVar105 * fVar125 + fVar7 * fVar137 + fVar8 * fVar130 + pfVar1[1];
              fVar112 = fVar105 * fVar126 + fVar7 * fVar95 + fVar8 * fVar98 + pfVar1[2];
              fVar105 = fVar105 * fVar128 + fVar7 * fVar96 + fVar8 * fVar99 + pfVar1[3];
            }
            else {
              uVar67 = uVar67 & 0xffffffff;
              bVar70 = (byte)uVar67 & bVar61;
              uVar71 = CONCAT71((int7)(uVar67 >> 8),bVar70);
              if (bVar70 == 1) {
                poVar64 = std::operator<<((ostream *)&std::cout,
                                          "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                         );
                std::endl<char,std::char_traits<char>>(poVar64);
                fVar79 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 0xc);
                fVar81 = *(float *)((long)pAVar14 + lVar74 + -0x24);
                fVar100 = *(float *)((long)pAVar14 + lVar74 + -0x14);
                fVar80 = *(float *)((long)pAVar14 + lVar74 + -4);
                auVar10 = *(undefined1 (*) [16])((long)pAVar14 + lVar74 + -0x30);
                pfVar3 = (float *)((long)pAVar14 + lVar74 + -0x20);
                fVar122 = *pfVar3;
                fVar127 = pfVar3[1];
                pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x10);
                fVar110 = *pfVar2;
                fVar101 = pfVar2[1];
                fVar104 = pfVar2[2];
                fVar128 = fVar81 * fVar100 + fVar79 * fVar80;
                fVar106 = fVar81 * fVar100 - fVar79 * fVar80;
                fVar112 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar100 * fVar100 + -fVar80 * fVar80;
                fVar125 = fVar79 * fVar79 - fVar81 * fVar81;
                fVar126 = fVar100 * fVar100 + fVar125 + -fVar80 * fVar80;
                fVar137 = fVar81 * fVar80 - fVar79 * fVar100;
                fVar94 = fVar79 * fVar100 + fVar81 * fVar80;
                fVar134 = fVar100 * fVar80 + fVar79 * fVar81;
                fVar79 = fVar100 * fVar80 - fVar79 * fVar81;
                pfVar2 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                fVar105 = *pfVar2;
                fVar7 = pfVar2[1];
                fVar8 = pfVar2[2];
                fVar128 = fVar128 + fVar128;
                fVar137 = fVar137 + fVar137;
                fVar106 = fVar106 + fVar106;
                fVar134 = fVar134 + fVar134;
                fVar94 = fVar94 + fVar94;
                fVar79 = fVar79 + fVar79;
                fVar81 = fVar80 * fVar80 + fVar125 + -fVar100 * fVar100;
                fVar113 = fVar112 * 1.0 + fVar128 * 0.0 + fVar137 * 0.0;
                fVar115 = fVar112 * 0.0 + fVar128 * 1.0 + fVar137 * 0.0;
                fVar118 = fVar112 * 0.0 + fVar128 * 0.0 + fVar137 * 1.0;
                fVar120 = fVar112 * 0.0 + fVar128 * 0.0 + fVar137 * 0.0;
                fVar107 = fVar106 * 1.0 + fVar126 * 0.0 + fVar134 * 0.0;
                fVar108 = fVar106 * 0.0 + fVar126 * 1.0 + fVar134 * 0.0;
                fVar109 = fVar106 * 0.0 + fVar126 * 0.0 + fVar134 * 1.0;
                fVar111 = fVar106 * 0.0 + fVar126 * 0.0 + fVar134 * 0.0;
                fVar106 = fVar94 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                fVar112 = fVar94 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                fVar128 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                fVar137 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                local_168 = auVar10._4_4_;
                fStack_164 = auVar10._8_4_;
                local_178 = auVar10._0_4_;
                fVar129 = local_178 * fVar113 + fVar107 * 0.0 + fVar106 * 0.0;
                fVar131 = local_178 * fVar115 + fVar108 * 0.0 + fVar112 * 0.0;
                fVar132 = local_178 * fVar118 + fVar109 * 0.0 + fVar128 * 0.0;
                fVar133 = local_178 * fVar120 + fVar111 * 0.0 + fVar137 * 0.0;
                fVar125 = fVar122 * fVar113 + fVar127 * fVar107 + fVar106 * 0.0;
                fVar126 = fVar122 * fVar115 + fVar127 * fVar108 + fVar112 * 0.0;
                fVar134 = fVar122 * fVar118 + fVar127 * fVar109 + fVar128 * 0.0;
                fVar95 = fVar122 * fVar120 + fVar127 * fVar111 + fVar137 * 0.0;
                local_148.l.vz.field_0.m128[0] =
                     fVar110 * fVar113 + fVar101 * fVar107 + fVar104 * fVar106;
                local_148.l.vz.field_0.m128[1] =
                     fVar110 * fVar115 + fVar101 * fVar108 + fVar104 * fVar112;
                local_148.l.vz.field_0.m128[2] =
                     fVar110 * fVar118 + fVar101 * fVar109 + fVar104 * fVar128;
                local_148.l.vz.field_0.m128[3] =
                     fVar110 * fVar120 + fVar101 * fVar111 + fVar104 * fVar137;
                fVar79 = pfVar1[0xf];
                fVar81 = pfVar1[3];
                fVar100 = pfVar1[7];
                fVar80 = pfVar1[0xb];
                fVar130 = fVar81 * fVar100 + fVar79 * fVar80;
                fVar96 = fVar81 * fVar100 - fVar79 * fVar80;
                fVar97 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar100 * fVar100 + -fVar80 * fVar80;
                fVar127 = fVar79 * fVar79 - fVar81 * fVar81;
                fVar136 = fVar100 * fVar100 + fVar127 + -fVar80 * fVar80;
                fVar135 = fVar81 * fVar80 - fVar79 * fVar100;
                fVar102 = fVar79 * fVar100 + fVar81 * fVar80;
                fVar138 = fVar100 * fVar80 + fVar79 * fVar81;
                fVar94 = fVar100 * fVar80 - fVar79 * fVar81;
                fVar79 = *pfVar1;
                fVar81 = pfVar1[4];
                fVar122 = pfVar1[5];
                fVar121 = fVar80 * fVar80 + fVar127 + -fVar100 * fVar100;
                fVar100 = pfVar1[8];
                fVar80 = pfVar1[9];
                fVar127 = pfVar1[10];
                fVar130 = fVar130 + fVar130;
                fVar135 = fVar135 + fVar135;
                fVar110 = pfVar1[0xc];
                fVar101 = pfVar1[0xd];
                fVar104 = pfVar1[0xe];
                fVar98 = fVar97 * 1.0 + fVar130 * 0.0 + fVar135 * 0.0;
                fVar99 = fVar97 * 0.0 + fVar130 * 1.0 + fVar135 * 0.0;
                fVar135 = fVar97 * 0.0 + fVar130 * 0.0 + fVar135 * 1.0;
                fVar96 = fVar96 + fVar96;
                fVar138 = fVar138 + fVar138;
                fVar102 = fVar102 + fVar102;
                fVar94 = fVar94 + fVar94;
                fVar97 = fVar96 * 1.0 + fVar136 * 0.0 + fVar138 * 0.0;
                fVar130 = fVar96 * 0.0 + fVar136 * 1.0 + fVar138 * 0.0;
                fVar96 = fVar96 * 0.0 + fVar136 * 0.0 + fVar138 * 1.0;
                fVar136 = fVar102 * 1.0 + fVar94 * 0.0 + fVar121 * 0.0;
                fVar138 = fVar102 * 0.0 + fVar94 * 1.0 + fVar121 * 0.0;
                fVar94 = fVar102 * 0.0 + fVar94 * 0.0 + fVar121 * 1.0;
                fVar114 = fVar79 * fVar98 + fVar97 * 0.0 + fVar136 * 0.0;
                fVar116 = fVar79 * fVar99 + fVar130 * 0.0 + fVar138 * 0.0;
                fVar119 = fVar79 * fVar135 + fVar96 * 0.0 + fVar94 * 0.0;
                fVar102 = fVar81 * fVar98 + fVar122 * fVar97 + fVar136 * 0.0;
                fVar121 = fVar81 * fVar99 + fVar122 * fVar130 + fVar138 * 0.0;
                fVar103 = fVar81 * fVar135 + fVar122 * fVar96 + fVar94 * 0.0;
                fVar122 = fVar100 * fVar98 + fVar80 * fVar97 + fVar127 * fVar136;
                fVar123 = fVar100 * fVar99 + fVar80 * fVar130 + fVar127 * fVar138;
                fVar124 = fVar100 * fVar135 + fVar80 * fVar96 + fVar127 * fVar94;
                fVar127 = fVar110 * fVar98 + fVar101 * fVar97 + fVar104 * fVar136 + pfVar1[1] + 0.0;
                fVar97 = fVar110 * fVar99 + fVar101 * fVar130 + fVar104 * fVar138 + pfVar1[2] + 0.0;
                fVar110 = fVar110 * fVar135 + fVar101 * fVar96 + fVar104 * fVar94 + pfVar1[6] + 0.0;
                fVar80 = fVar114 * fVar129 +
                         fVar116 * fVar125 + fVar119 * local_148.l.vz.field_0.m128[0];
                local_178 = fVar114 * fVar131 +
                            fVar116 * fVar126 + fVar119 * local_148.l.vz.field_0.m128[1];
                fVar81 = fVar114 * fVar132 +
                         fVar116 * fVar134 + fVar119 * local_148.l.vz.field_0.m128[2];
                fVar79 = fVar122 * fVar129 +
                         fVar123 * fVar125 + fVar124 * local_148.l.vz.field_0.m128[0];
                fVar100 = fVar122 * fVar131 +
                          fVar123 * fVar126 + fVar124 * local_148.l.vz.field_0.m128[1];
                fVar101 = fVar122 * fVar132 +
                          fVar123 * fVar134 + fVar124 * local_148.l.vz.field_0.m128[2];
                uVar71 = extraout_RDX_17;
                fVar104 = fVar122 * fVar133 +
                          fVar123 * fVar95 + fVar124 * local_148.l.vz.field_0.m128[3];
                fVar122 = fVar114 * fVar133 +
                          fVar116 * fVar95 + fVar119 * local_148.l.vz.field_0.m128[3];
                fVar94 = fVar127 * fVar129 +
                         fVar97 * fVar125 + fVar110 * local_148.l.vz.field_0.m128[0] +
                         fVar105 * fVar113 + fVar7 * fVar107 + fVar8 * fVar106 + local_168 + 0.0;
                fVar106 = fVar127 * fVar131 +
                          fVar97 * fVar126 + fVar110 * local_148.l.vz.field_0.m128[1] +
                          fVar105 * fVar115 + fVar7 * fVar108 + fVar8 * fVar112 + fStack_164 + 0.0;
                fVar112 = fVar127 * fVar132 +
                          fVar97 * fVar134 + fVar110 * local_148.l.vz.field_0.m128[2] +
                          fVar105 * fVar118 + fVar7 * fVar109 + fVar8 * fVar128 + pfVar3[2] + 0.0;
                fVar105 = fVar127 * fVar133 +
                          fVar97 * fVar95 + fVar110 * local_148.l.vz.field_0.m128[3] +
                          fVar105 * fVar120 + fVar7 * fVar111 + fVar8 * fVar137 + 0.0;
                uVar62 = fVar102 * fVar129 +
                         fVar121 * fVar125 + fVar103 * local_148.l.vz.field_0.m128[0];
                uVar117 = fVar102 * fVar131 +
                          fVar121 * fVar126 + fVar103 * local_148.l.vz.field_0.m128[1];
                fVar127 = fVar102 * fVar132 +
                          fVar121 * fVar134 + fVar103 * local_148.l.vz.field_0.m128[2];
                fVar110 = fVar102 * fVar133 +
                          fVar121 * fVar95 + fVar103 * local_148.l.vz.field_0.m128[3];
              }
              else {
                bVar61 = bVar11 ^ 1U | bVar61;
                if (bVar61 == 0) {
                  local_d8 = ZEXT416(*(uint *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 0xc));
                  local_b8 = ZEXT416(*(uint *)((long)pAVar14 + lVar74 + -0x24));
                  local_a8 = ZEXT416(*(uint *)((long)pAVar14 + lVar74 + -0x14));
                  local_e8 = ZEXT416(*(uint *)((long)pAVar14 + lVar74 + -4));
                  pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x20);
                  local_108 = *pfVar2;
                  fStack_104 = pfVar2[1];
                  fStack_c0 = pfVar2[2];
                  fStack_fc = pfVar2[3];
                  pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x10);
                  local_f8 = *pfVar2;
                  fStack_f4 = pfVar2[1];
                  fStack_f0 = pfVar2[2];
                  fStack_ec = pfVar2[3];
                  pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x30);
                  local_88 = *pfVar2;
                  fStack_7c = pfVar2[1];
                  fVar79 = *pfVar1;
                  fVar100 = pfVar1[1];
                  fVar122 = pfVar1[2];
                  fVar127 = pfVar1[4];
                  fVar110 = pfVar1[5];
                  fVar101 = pfVar1[6];
                  local_148.p.field_0._0_8_ = *(undefined8 *)(pfVar1 + 8);
                  local_148.p.field_0._8_8_ = *(undefined8 *)(pfVar1 + 10);
                  fVar104 = pfVar1[0xc];
                  fVar94 = pfVar1[0xd];
                  fVar106 = pfVar1[0xe];
                  fVar80 = fVar79 * local_88 + fVar100 * local_108 + fVar122 * local_f8;
                  fVar112 = fVar79 * 0.0 + fVar100 * fStack_104 + fVar122 * fStack_f4;
                  fVar79 = fVar79 * 0.0 + fVar100 * 0.0 + fVar122 * fStack_f0;
                  local_148.l.vz.field_0.m128[0] =
                       fVar127 * local_88 + fVar110 * local_108 + fVar101 * local_f8;
                  local_148.l.vz.field_0.m128[1] =
                       fVar127 * 0.0 + fVar110 * fStack_104 + fVar101 * fStack_f4;
                  local_148.l.vz.field_0.m128[2] =
                       fVar127 * 0.0 + fVar110 * 0.0 + fVar101 * fStack_f0;
                  local_148.l.vz.field_0.m128[3] =
                       fVar127 * fStack_7c + fVar110 * fStack_fc + fVar101 * fStack_ec;
                  fStack_100 = 0.0;
                  fStack_84 = 0.0;
                  fStack_80 = 0.0;
                  pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                  local_98._0_4_ =
                       fVar104 * local_88 + fVar94 * local_108 + fVar106 * local_f8 + *pfVar1;
                  local_98._4_4_ =
                       fVar104 * 0.0 + fVar94 * fStack_104 + fVar106 * fStack_f4 + pfVar1[1];
                  fStack_90 = fVar104 * 0.0 + fVar94 * 0.0 + fVar106 * fStack_f0 + pfVar1[2];
                  register0x0000128c =
                       fVar104 * fStack_7c + fVar94 * fStack_fc + fVar106 * fStack_ec + pfVar1[3];
                  local_c8 = local_108;
                  fStack_c4 = fStack_104;
                  fStack_bc = fStack_fc;
                  if (((fVar112 != 0.0) || (NAN(fVar112))) ||
                     ((fVar79 != 0.0 ||
                      (((NAN(fVar79) || (local_148.l.vz.field_0.m128[2] != 0.0)) ||
                       (NAN(local_148.l.vz.field_0.m128[2]))))))) {
                    poVar64 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar64);
                    uVar71 = extraout_RDX_19;
                  }
                  fVar79 = local_88 * local_148.p.field_0.m128[0] +
                           local_108 * local_148.p.field_0.m128[1] +
                           local_f8 * local_148.p.field_0.m128[2];
                  fVar100 = fStack_84 * local_148.p.field_0.m128[0] +
                            fStack_104 * local_148.p.field_0.m128[1] +
                            fStack_f4 * local_148.p.field_0.m128[2];
                  fVar101 = fStack_80 * local_148.p.field_0.m128[0] +
                            fStack_100 * local_148.p.field_0.m128[1] +
                            fStack_f0 * local_148.p.field_0.m128[2];
                  local_148.l.vy.field_0._8_1_ = 1;
                  fVar104 = (float)local_e8._0_4_;
                  fVar122 = (float)local_b8._0_4_;
                  fVar94 = (float)local_98._0_4_;
                  fVar106 = (float)local_98._4_4_;
                  fVar112 = fStack_90;
                  fVar105 = (float)local_d8._0_4_;
                  uVar62 = local_148.l.vz.field_0.m128[0];
                  uVar117 = local_148.l.vz.field_0.m128[1];
                  fVar127 = fStack_c0;
                  fVar110 = (float)local_a8._0_4_;
                }
                else {
                  if (((local_178 != 0.0) || (NAN(local_178))) ||
                     ((fVar81 != 0.0 ||
                      ((NAN(fVar81) ||
                       (uVar66 = *(undefined8 *)((long)pAVar14 + lVar74 + -0x10),
                       auVar26._4_4_ = -(uint)(*(float *)((long)pAVar14 + lVar74 + -0x20) != 0.0),
                       auVar26._0_4_ = -(uint)(*(float *)((long)pAVar14 + lVar74 + -0x18) != 0.0),
                       auVar26._8_4_ = -(uint)((float)uVar66 != 0.0),
                       auVar26._12_4_ = -(uint)((float)((ulong)uVar66 >> 0x20) != 0.0),
                       uVar62 = movmskps((int)CONCAT71(uVar69,bVar61),auVar26), (char)uVar62 != '\0'
                       )))))) {
                    poVar64 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar64);
                    uVar71 = extraout_RDX_18;
                  }
                  fVar79 = pfVar1[8];
                  fVar100 = pfVar1[9];
                  uVar66 = *(undefined8 *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                  fVar80 = *(float *)((long)pAVar14 + lVar74 + -0x30) * *pfVar1;
                  local_178 = pfVar1[1] + (float)uVar66;
                  fVar81 = pfVar1[2] + (float)((ulong)uVar66 >> 0x20);
                  fVar101 = pfVar1[10] * *(float *)((long)pAVar14 + lVar74 + -8);
                  local_148.l.vy.field_0._8_1_ = 1;
                  fVar104 = pfVar1[0xb];
                  fVar122 = pfVar1[3];
                  fVar94 = pfVar1[0xc];
                  fVar106 = pfVar1[0xd];
                  fVar112 = pfVar1[0xe];
                  fVar105 = pfVar1[0xf];
                  uVar62 = pfVar1[4];
                  uVar117 = pfVar1[5] * *(float *)((long)pAVar14 + lVar74 + -0x1c);
                  fVar127 = pfVar1[6] + *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 8);
                  fVar110 = pfVar1[7];
                }
              }
            }
          }
          else {
            pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x24);
            auVar23._4_4_ = -(uint)(pfVar2[1] != 0.0);
            auVar23._0_4_ = -(uint)(*pfVar2 != 0.0);
            auVar23._8_4_ = -(uint)(pfVar2[2] != 1.0);
            auVar23._12_4_ = -(uint)(pfVar2[3] != 0.0);
            uVar75 = movmskps(uVar75,auVar23);
            if ((((bVar11 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
               (((uVar75 & 4) != 0 ||
                (bVar70 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70),
                bVar70 != 0)))) goto LAB_001543dc;
            pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x14);
            auVar24._4_4_ = -(uint)(pfVar2[1] != 0.0);
            auVar24._0_4_ = -(uint)(*pfVar2 != 0.0);
            auVar24._8_4_ = -(uint)(pfVar2[2] != 0.0);
            auVar24._12_4_ = -(uint)(pfVar2[3] != 1.0);
            uVar75 = movmskps(uVar75,auVar24);
            if (((((bVar11 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0)) ||
               (bVar70 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70),
               bVar70 != 0)) goto LAB_001543dc;
            pfVar2 = (float *)((long)pAVar14 + lVar74 + -4);
            auVar25._4_4_ = -(uint)(pfVar2[1] != 0.0);
            auVar25._0_4_ = -(uint)(*pfVar2 != 0.0);
            auVar25._8_4_ = -(uint)(pfVar2[2] != 0.0);
            auVar25._12_4_ = -(uint)(pfVar2[3] != 0.0);
            uVar75 = movmskps(uVar75,auVar25);
            if ((((bVar11 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0))
            goto LAB_001543dc;
            bVar70 = ((byte)uVar75 & 8) >> 3;
            uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
            uVar71 = (ulong)uVar75;
            if ((bVar70 != 0) ||
               ((bVar11 != false &&
                ((fVar79 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 0xc), fVar79 != 1.0
                 || (NAN(fVar79))))))) goto LAB_001543dc;
            fVar80 = *pfVar1;
            local_178 = pfVar1[1];
            fVar81 = pfVar1[2];
            fVar122 = pfVar1[3];
            uVar62 = pfVar1[4];
            uVar117 = pfVar1[5];
            fVar127 = pfVar1[6];
            fVar110 = pfVar1[7];
            fVar79 = pfVar1[8];
            fVar100 = pfVar1[9];
            fVar101 = pfVar1[10];
            fVar104 = pfVar1[0xb];
            fVar94 = pfVar1[0xc];
            fVar106 = pfVar1[0xd];
            fVar112 = pfVar1[0xe];
            fVar105 = pfVar1[0xf];
            local_148.l.vy.field_0._8_1_ = bVar61;
          }
LAB_00154af6:
          pfVar1 = (float *)(local_148.l.vy.field_0._0_8_ + -0x30 + lVar74);
          *pfVar1 = fVar80;
          pfVar1[1] = local_178;
          pfVar1[2] = fVar81;
          pfVar1[3] = fVar122;
          pfVar1 = (float *)(local_148.l.vy.field_0._0_8_ + -0x20 + lVar74);
          *pfVar1 = (float)uVar62;
          pfVar1[1] = (float)uVar117;
          pfVar1[2] = fVar127;
          pfVar1[3] = fVar110;
          pfVar1 = (float *)(local_148.l.vy.field_0._0_8_ + -0x10 + lVar74);
          *pfVar1 = fVar79;
          pfVar1[1] = fVar100;
          pfVar1[2] = fVar101;
          pfVar1[3] = fVar104;
          pfVar1 = (float *)(local_148.l.vy.field_0._0_8_ + lVar74);
          *pfVar1 = fVar94;
          pfVar1[1] = fVar106;
          pfVar1[2] = fVar112;
          pfVar1[3] = fVar105;
          lVar74 = lVar74 + 0x40;
          uVar66 = local_148.l.vy.field_0._0_8_;
        }
      }
      else {
        if (sVar13 != plVar63[0xf]) {
          prVar68 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar68,"number of transformations does not match");
          __cxa_throw(prVar68,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        fVar79 = (spaces->time_range).lower;
        fVar81 = (spaces->time_range).upper;
        fVar100 = (float)plVar63[0xd];
        fVar80 = (float)((ulong)plVar63[0xd] >> 0x20);
        uVar75 = -(uint)(fVar79 < fVar100);
        uVar77 = -(uint)(fVar81 < fVar80);
        local_158._0_8_ =
             CONCAT44(~uVar77 & (uint)fVar80,~uVar75 & (uint)fVar79) |
             CONCAT44((uint)fVar81 & uVar77,(uint)fVar100 & uVar75);
        local_148.l.vy.field_0._0_8_ = (void *)0x0;
        local_148.l.vx.field_0._0_8_ = 0;
        local_148.l.vx.field_0._8_8_ = 0;
        if (sVar13 != 0) {
          local_148.l.vy.field_0._0_8_ = alignedMalloc(sVar13 << 6,0x10);
          uVar71 = extraout_RDX_16;
          local_148.l.vx.field_0._8_8_ = sVar13;
        }
        if (spaces->quaternion == false) {
          uVar66 = ZEXT48(*(uint *)(plVar63 + 0x12));
        }
        else {
          uVar66 = (void *)0x1;
        }
        lVar74 = 0x30;
        local_148.l.vy.field_0._8_1_ = (undefined1)uVar66;
        local_148.l.vx.field_0._0_8_ = local_148.l.vx.field_0._8_8_;
        for (uVar72 = 0; uVar75 = (uint)uVar71, uVar72 < (spaces->spaces).size_active;
            uVar72 = uVar72 + 1) {
          pAVar14 = (spaces->spaces).items;
          lVar15 = plVar63[0x11];
          bVar11 = spaces->quaternion;
          uVar69 = (undefined7)((ulong)uVar66 >> 8);
          uVar67 = CONCAT71(uVar69,bVar11);
          bVar61 = *(byte *)(plVar63 + 0x12);
          local_148.l.vy.field_0._8_1_ = 0;
          fVar79 = *(float *)((long)pAVar14 + lVar74 + -0x30);
          uVar66 = *(undefined8 *)((long)pAVar14 + lVar74 + -0x2c);
          fVar81 = (float)((ulong)uVar66 >> 0x20);
          local_178 = (float)uVar66;
          if ((((fVar79 != 1.0) || (NAN(fVar79))) || (local_178 != 0.0)) ||
             (((NAN(local_178) || (fVar81 != 0.0)) || (NAN(fVar81))))) {
LAB_00154fa6:
            uVar66 = *(undefined8 *)(lVar15 + -0x30 + lVar74);
            fVar100 = (float)uVar66;
            fVar122 = (float)((ulong)uVar66 >> 0x20);
            iVar76 = -(uint)(fVar100 != 1.0);
            iVar78 = -(uint)(fVar122 != 0.0);
            auVar93._4_4_ = iVar78;
            auVar93._0_4_ = iVar76;
            auVar93._8_4_ = iVar78;
            auVar93._12_4_ = iVar78;
            auVar92._8_8_ = auVar93._8_8_;
            auVar92._4_4_ = iVar76;
            auVar92._0_4_ = iVar76;
            uVar75 = movmskpd(uVar75,auVar92);
            fVar79 = *(float *)(lVar15 + -0x28 + lVar74);
            if (((((uVar75 & 1) == 0) && (bVar70 = (byte)uVar75 >> 1, bVar70 == 0)) &&
                (fVar79 == 0.0)) && (!NAN(fVar79))) {
              pfVar1 = (float *)(lVar15 + -0x24 + lVar74);
              auVar48._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar48._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar48._8_4_ = -(uint)(pfVar1[2] != 1.0);
              auVar48._12_4_ = -(uint)(pfVar1[3] != 0.0);
              uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar48);
              if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                 (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                pfVar1 = (float *)(lVar15 + -0x14 + lVar74);
                auVar49._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar49._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar49._8_4_ = -(uint)(pfVar1[2] != 0.0);
                auVar49._12_4_ = -(uint)(pfVar1[3] != 1.0);
                uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar49);
                if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                   (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                  pfVar1 = (float *)(lVar15 + -4 + lVar74);
                  auVar50._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar50._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar50._8_4_ = -(uint)(pfVar1[2] != 0.0);
                  auVar50._12_4_ = -(uint)(pfVar1[3] != 0.0);
                  uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar50);
                  if ((((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                       ((uVar75 & 4) == 0)) &&
                      (bVar70 = ((byte)uVar75 & 8) >> 3,
                      uVar71 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 == 0)) &&
                     ((bVar61 == 0 ||
                      ((fVar80 = *(float *)(lVar15 + 0xc + lVar74), fVar80 == 1.0 && (!NAN(fVar80)))
                      )))) {
                    pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x30);
                    fVar80 = *pfVar1;
                    local_178 = pfVar1[1];
                    fVar81 = pfVar1[2];
                    fVar122 = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x20);
                    uVar62 = *pfVar1;
                    uVar117 = pfVar1[1];
                    fVar127 = pfVar1[2];
                    fVar110 = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x10);
                    fVar79 = *pfVar1;
                    fVar100 = pfVar1[1];
                    fVar101 = pfVar1[2];
                    fVar104 = pfVar1[3];
                    pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                    fVar94 = *pfVar1;
                    fVar106 = pfVar1[1];
                    fVar112 = pfVar1[2];
                    fVar105 = pfVar1[3];
                    local_148.l.vy.field_0._8_1_ = bVar11;
                    goto LAB_001556d7;
                  }
                }
              }
            }
            uVar71 = uVar67 & 0xffffffff;
            bVar70 = (byte)uVar71 | bVar61;
            uVar71 = CONCAT71((int7)(uVar71 >> 8),bVar70);
            if (bVar70 == 0) {
              pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x30);
              fVar112 = *pfVar1;
              fVar125 = pfVar1[1];
              fVar126 = pfVar1[2];
              fVar128 = pfVar1[3];
              pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x20);
              fVar134 = *pfVar1;
              fVar137 = pfVar1[1];
              fVar95 = pfVar1[2];
              fVar96 = pfVar1[3];
              pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x10);
              fVar97 = *pfVar1;
              fVar130 = pfVar1[1];
              fVar98 = pfVar1[2];
              fVar99 = pfVar1[3];
              fVar80 = fVar100 * fVar112 + fVar122 * fVar134 + fVar79 * fVar97;
              local_178 = fVar100 * fVar125 + fVar122 * fVar137 + fVar79 * fVar130;
              fVar81 = fVar100 * fVar126 + fVar122 * fVar95 + fVar79 * fVar98;
              fVar122 = fVar100 * fVar128 + fVar122 * fVar96 + fVar79 * fVar99;
              fVar79 = *(float *)(lVar15 + -0x20 + lVar74);
              fVar100 = *(float *)(lVar15 + -0x1c + lVar74);
              fVar110 = *(float *)(lVar15 + -0x18 + lVar74);
              fVar104 = *(float *)(lVar15 + -0x10 + lVar74);
              uVar62 = fVar79 * fVar112 + fVar100 * fVar134 + fVar110 * fVar97;
              uVar117 = fVar79 * fVar125 + fVar100 * fVar137 + fVar110 * fVar130;
              fVar127 = fVar79 * fVar126 + fVar100 * fVar95 + fVar110 * fVar98;
              fVar110 = fVar79 * fVar128 + fVar100 * fVar96 + fVar110 * fVar99;
              fVar94 = *(float *)(lVar15 + -0xc + lVar74);
              fVar106 = *(float *)(lVar15 + -8 + lVar74);
              fVar79 = fVar104 * fVar112 + fVar94 * fVar134 + fVar106 * fVar97;
              fVar100 = fVar104 * fVar125 + fVar94 * fVar137 + fVar106 * fVar130;
              fVar101 = fVar104 * fVar126 + fVar94 * fVar95 + fVar106 * fVar98;
              fVar104 = fVar104 * fVar128 + fVar94 * fVar96 + fVar106 * fVar99;
              fVar105 = *(float *)(lVar15 + lVar74);
              fVar7 = *(float *)(lVar15 + 4 + lVar74);
              fVar8 = *(float *)(lVar15 + 8 + lVar74);
              pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
              fVar94 = fVar105 * fVar112 + fVar7 * fVar134 + fVar8 * fVar97 + *pfVar1;
              fVar106 = fVar105 * fVar125 + fVar7 * fVar137 + fVar8 * fVar130 + pfVar1[1];
              fVar112 = fVar105 * fVar126 + fVar7 * fVar95 + fVar8 * fVar98 + pfVar1[2];
              fVar105 = fVar105 * fVar128 + fVar7 * fVar96 + fVar8 * fVar99 + pfVar1[3];
            }
            else {
              uVar67 = uVar67 & 0xffffffff;
              bVar70 = (byte)uVar67 & bVar61;
              uVar71 = CONCAT71((int7)(uVar67 >> 8),bVar70);
              if (bVar70 == 1) {
                poVar64 = std::operator<<((ostream *)&std::cout,
                                          "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                         );
                std::endl<char,std::char_traits<char>>(poVar64);
                fVar79 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 0xc);
                fVar81 = *(float *)((long)pAVar14 + lVar74 + -0x24);
                fVar100 = *(float *)((long)pAVar14 + lVar74 + -0x14);
                fVar80 = *(float *)((long)pAVar14 + lVar74 + -4);
                auVar10 = *(undefined1 (*) [16])((long)pAVar14 + lVar74 + -0x30);
                pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x20);
                fVar122 = *pfVar2;
                fVar127 = pfVar2[1];
                pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x10);
                fVar110 = *pfVar1;
                fVar101 = pfVar1[1];
                fVar104 = pfVar1[2];
                fVar128 = fVar81 * fVar100 + fVar79 * fVar80;
                fVar106 = fVar81 * fVar100 - fVar79 * fVar80;
                fVar112 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar100 * fVar100 + -fVar80 * fVar80;
                fVar125 = fVar79 * fVar79 - fVar81 * fVar81;
                fVar126 = fVar100 * fVar100 + fVar125 + -fVar80 * fVar80;
                fVar137 = fVar81 * fVar80 - fVar79 * fVar100;
                fVar94 = fVar79 * fVar100 + fVar81 * fVar80;
                fVar134 = fVar100 * fVar80 + fVar79 * fVar81;
                fVar79 = fVar100 * fVar80 - fVar79 * fVar81;
                pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                fVar105 = *pfVar1;
                fVar7 = pfVar1[1];
                fVar8 = pfVar1[2];
                fVar128 = fVar128 + fVar128;
                fVar137 = fVar137 + fVar137;
                fVar106 = fVar106 + fVar106;
                fVar134 = fVar134 + fVar134;
                fVar94 = fVar94 + fVar94;
                fVar79 = fVar79 + fVar79;
                fVar81 = fVar80 * fVar80 + fVar125 + -fVar100 * fVar100;
                fVar113 = fVar112 * 1.0 + fVar128 * 0.0 + fVar137 * 0.0;
                fVar115 = fVar112 * 0.0 + fVar128 * 1.0 + fVar137 * 0.0;
                fVar118 = fVar112 * 0.0 + fVar128 * 0.0 + fVar137 * 1.0;
                fVar120 = fVar112 * 0.0 + fVar128 * 0.0 + fVar137 * 0.0;
                fVar107 = fVar106 * 1.0 + fVar126 * 0.0 + fVar134 * 0.0;
                fVar108 = fVar106 * 0.0 + fVar126 * 1.0 + fVar134 * 0.0;
                fVar109 = fVar106 * 0.0 + fVar126 * 0.0 + fVar134 * 1.0;
                fVar111 = fVar106 * 0.0 + fVar126 * 0.0 + fVar134 * 0.0;
                fVar106 = fVar94 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                fVar112 = fVar94 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                fVar128 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                fVar137 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                local_168 = auVar10._4_4_;
                fStack_164 = auVar10._8_4_;
                local_178 = auVar10._0_4_;
                fVar129 = local_178 * fVar113 + fVar107 * 0.0 + fVar106 * 0.0;
                fVar131 = local_178 * fVar115 + fVar108 * 0.0 + fVar112 * 0.0;
                fVar132 = local_178 * fVar118 + fVar109 * 0.0 + fVar128 * 0.0;
                fVar133 = local_178 * fVar120 + fVar111 * 0.0 + fVar137 * 0.0;
                fVar125 = fVar122 * fVar113 + fVar127 * fVar107 + fVar106 * 0.0;
                fVar126 = fVar122 * fVar115 + fVar127 * fVar108 + fVar112 * 0.0;
                fVar134 = fVar122 * fVar118 + fVar127 * fVar109 + fVar128 * 0.0;
                fVar95 = fVar122 * fVar120 + fVar127 * fVar111 + fVar137 * 0.0;
                local_148.l.vz.field_0.m128[0] =
                     fVar110 * fVar113 + fVar101 * fVar107 + fVar104 * fVar106;
                local_148.l.vz.field_0.m128[1] =
                     fVar110 * fVar115 + fVar101 * fVar108 + fVar104 * fVar112;
                local_148.l.vz.field_0.m128[2] =
                     fVar110 * fVar118 + fVar101 * fVar109 + fVar104 * fVar128;
                local_148.l.vz.field_0.m128[3] =
                     fVar110 * fVar120 + fVar101 * fVar111 + fVar104 * fVar137;
                fVar79 = *(float *)(lVar15 + 0xc + lVar74);
                fVar81 = *(float *)(lVar15 + -0x24 + lVar74);
                fVar100 = *(float *)(lVar15 + -0x14 + lVar74);
                fVar80 = *(float *)(lVar15 + -4 + lVar74);
                fVar130 = fVar81 * fVar100 + fVar79 * fVar80;
                fVar96 = fVar81 * fVar100 - fVar79 * fVar80;
                fVar97 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar100 * fVar100 + -fVar80 * fVar80;
                fVar127 = fVar79 * fVar79 - fVar81 * fVar81;
                fVar136 = fVar100 * fVar100 + fVar127 + -fVar80 * fVar80;
                fVar135 = fVar81 * fVar80 - fVar79 * fVar100;
                fVar102 = fVar79 * fVar100 + fVar81 * fVar80;
                fVar138 = fVar100 * fVar80 + fVar79 * fVar81;
                fVar94 = fVar100 * fVar80 - fVar79 * fVar81;
                pfVar3 = (float *)(lVar15 + -0x30 + lVar74);
                fVar79 = *pfVar3;
                pfVar4 = (float *)(lVar15 + -0x20 + lVar74);
                fVar81 = *pfVar4;
                fVar122 = pfVar4[1];
                fVar121 = fVar80 * fVar80 + fVar127 + -fVar100 * fVar100;
                pfVar1 = (float *)(lVar15 + -0x10 + lVar74);
                fVar100 = *pfVar1;
                fVar80 = pfVar1[1];
                fVar127 = pfVar1[2];
                fVar130 = fVar130 + fVar130;
                fVar135 = fVar135 + fVar135;
                pfVar1 = (float *)(lVar15 + lVar74);
                fVar110 = *pfVar1;
                fVar101 = pfVar1[1];
                fVar104 = pfVar1[2];
                fVar98 = fVar97 * 1.0 + fVar130 * 0.0 + fVar135 * 0.0;
                fVar99 = fVar97 * 0.0 + fVar130 * 1.0 + fVar135 * 0.0;
                fVar135 = fVar97 * 0.0 + fVar130 * 0.0 + fVar135 * 1.0;
                fVar96 = fVar96 + fVar96;
                fVar138 = fVar138 + fVar138;
                fVar102 = fVar102 + fVar102;
                fVar94 = fVar94 + fVar94;
                fVar97 = fVar96 * 1.0 + fVar136 * 0.0 + fVar138 * 0.0;
                fVar130 = fVar96 * 0.0 + fVar136 * 1.0 + fVar138 * 0.0;
                fVar96 = fVar96 * 0.0 + fVar136 * 0.0 + fVar138 * 1.0;
                fVar136 = fVar102 * 1.0 + fVar94 * 0.0 + fVar121 * 0.0;
                fVar138 = fVar102 * 0.0 + fVar94 * 1.0 + fVar121 * 0.0;
                fVar94 = fVar102 * 0.0 + fVar94 * 0.0 + fVar121 * 1.0;
                fVar114 = fVar79 * fVar98 + fVar97 * 0.0 + fVar136 * 0.0;
                fVar116 = fVar79 * fVar99 + fVar130 * 0.0 + fVar138 * 0.0;
                fVar119 = fVar79 * fVar135 + fVar96 * 0.0 + fVar94 * 0.0;
                fVar102 = fVar81 * fVar98 + fVar122 * fVar97 + fVar136 * 0.0;
                fVar121 = fVar81 * fVar99 + fVar122 * fVar130 + fVar138 * 0.0;
                fVar103 = fVar81 * fVar135 + fVar122 * fVar96 + fVar94 * 0.0;
                fVar122 = fVar100 * fVar98 + fVar80 * fVar97 + fVar127 * fVar136;
                fVar123 = fVar100 * fVar99 + fVar80 * fVar130 + fVar127 * fVar138;
                fVar124 = fVar100 * fVar135 + fVar80 * fVar96 + fVar127 * fVar94;
                fVar127 = fVar110 * fVar98 + fVar101 * fVar97 + fVar104 * fVar136 + pfVar3[1] + 0.0;
                fVar97 = fVar110 * fVar99 + fVar101 * fVar130 + fVar104 * fVar138 + pfVar3[2] + 0.0;
                fVar110 = fVar110 * fVar135 + fVar101 * fVar96 + fVar104 * fVar94 + pfVar4[2] + 0.0;
                fVar80 = fVar114 * fVar129 +
                         fVar116 * fVar125 + fVar119 * local_148.l.vz.field_0.m128[0];
                local_178 = fVar114 * fVar131 +
                            fVar116 * fVar126 + fVar119 * local_148.l.vz.field_0.m128[1];
                fVar81 = fVar114 * fVar132 +
                         fVar116 * fVar134 + fVar119 * local_148.l.vz.field_0.m128[2];
                fVar79 = fVar122 * fVar129 +
                         fVar123 * fVar125 + fVar124 * local_148.l.vz.field_0.m128[0];
                fVar100 = fVar122 * fVar131 +
                          fVar123 * fVar126 + fVar124 * local_148.l.vz.field_0.m128[1];
                fVar101 = fVar122 * fVar132 +
                          fVar123 * fVar134 + fVar124 * local_148.l.vz.field_0.m128[2];
                uVar71 = extraout_RDX_20;
                fVar104 = fVar122 * fVar133 +
                          fVar123 * fVar95 + fVar124 * local_148.l.vz.field_0.m128[3];
                fVar122 = fVar114 * fVar133 +
                          fVar116 * fVar95 + fVar119 * local_148.l.vz.field_0.m128[3];
                fVar94 = fVar127 * fVar129 +
                         fVar97 * fVar125 + fVar110 * local_148.l.vz.field_0.m128[0] +
                         fVar105 * fVar113 + fVar7 * fVar107 + fVar8 * fVar106 + local_168 + 0.0;
                fVar106 = fVar127 * fVar131 +
                          fVar97 * fVar126 + fVar110 * local_148.l.vz.field_0.m128[1] +
                          fVar105 * fVar115 + fVar7 * fVar108 + fVar8 * fVar112 + fStack_164 + 0.0;
                fVar112 = fVar127 * fVar132 +
                          fVar97 * fVar134 + fVar110 * local_148.l.vz.field_0.m128[2] +
                          fVar105 * fVar118 + fVar7 * fVar109 + fVar8 * fVar128 + pfVar2[2] + 0.0;
                fVar105 = fVar127 * fVar133 +
                          fVar97 * fVar95 + fVar110 * local_148.l.vz.field_0.m128[3] +
                          fVar105 * fVar120 + fVar7 * fVar111 + fVar8 * fVar137 + 0.0;
                uVar62 = fVar102 * fVar129 +
                         fVar121 * fVar125 + fVar103 * local_148.l.vz.field_0.m128[0];
                uVar117 = fVar102 * fVar131 +
                          fVar121 * fVar126 + fVar103 * local_148.l.vz.field_0.m128[1];
                fVar127 = fVar102 * fVar132 +
                          fVar121 * fVar134 + fVar103 * local_148.l.vz.field_0.m128[2];
                fVar110 = fVar102 * fVar133 +
                          fVar121 * fVar95 + fVar103 * local_148.l.vz.field_0.m128[3];
              }
              else {
                bVar61 = bVar11 ^ 1U | bVar61;
                if (bVar61 == 0) {
                  local_d8 = ZEXT416(*(uint *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 0xc));
                  local_b8 = ZEXT416(*(uint *)((long)pAVar14 + lVar74 + -0x24));
                  local_a8 = ZEXT416(*(uint *)((long)pAVar14 + lVar74 + -0x14));
                  local_e8 = ZEXT416(*(uint *)((long)pAVar14 + lVar74 + -4));
                  pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x20);
                  local_108 = *pfVar1;
                  fStack_104 = pfVar1[1];
                  fStack_c0 = pfVar1[2];
                  fStack_fc = pfVar1[3];
                  pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x10);
                  local_f8 = *pfVar1;
                  fStack_f4 = pfVar1[1];
                  fStack_f0 = pfVar1[2];
                  fStack_ec = pfVar1[3];
                  pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x30);
                  local_88 = *pfVar1;
                  fStack_7c = pfVar1[1];
                  pfVar1 = (float *)(lVar15 + -0x30 + lVar74);
                  fVar79 = *pfVar1;
                  fVar100 = pfVar1[1];
                  fVar122 = pfVar1[2];
                  pfVar1 = (float *)(lVar15 + -0x20 + lVar74);
                  fVar127 = *pfVar1;
                  fVar110 = pfVar1[1];
                  fVar101 = pfVar1[2];
                  puVar5 = (undefined8 *)(lVar15 + -0x10 + lVar74);
                  local_148.p.field_0._0_8_ = *puVar5;
                  local_148.p.field_0._8_8_ = puVar5[1];
                  pfVar1 = (float *)(lVar15 + lVar74);
                  fVar104 = *pfVar1;
                  fVar94 = pfVar1[1];
                  fVar106 = pfVar1[2];
                  fVar80 = fVar79 * local_88 + fVar100 * local_108 + fVar122 * local_f8;
                  fVar112 = fVar79 * 0.0 + fVar100 * fStack_104 + fVar122 * fStack_f4;
                  fVar79 = fVar79 * 0.0 + fVar100 * 0.0 + fVar122 * fStack_f0;
                  local_148.l.vz.field_0.m128[0] =
                       fVar127 * local_88 + fVar110 * local_108 + fVar101 * local_f8;
                  local_148.l.vz.field_0.m128[1] =
                       fVar127 * 0.0 + fVar110 * fStack_104 + fVar101 * fStack_f4;
                  local_148.l.vz.field_0.m128[2] =
                       fVar127 * 0.0 + fVar110 * 0.0 + fVar101 * fStack_f0;
                  local_148.l.vz.field_0.m128[3] =
                       fVar127 * fStack_7c + fVar110 * fStack_fc + fVar101 * fStack_ec;
                  fStack_100 = 0.0;
                  fStack_84 = 0.0;
                  fStack_80 = 0.0;
                  pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                  local_98._0_4_ =
                       fVar104 * local_88 + fVar94 * local_108 + fVar106 * local_f8 + *pfVar1;
                  local_98._4_4_ =
                       fVar104 * 0.0 + fVar94 * fStack_104 + fVar106 * fStack_f4 + pfVar1[1];
                  fStack_90 = fVar104 * 0.0 + fVar94 * 0.0 + fVar106 * fStack_f0 + pfVar1[2];
                  register0x0000128c =
                       fVar104 * fStack_7c + fVar94 * fStack_fc + fVar106 * fStack_ec + pfVar1[3];
                  local_c8 = local_108;
                  fStack_c4 = fStack_104;
                  fStack_bc = fStack_fc;
                  if (((fVar112 != 0.0) || (NAN(fVar112))) ||
                     ((fVar79 != 0.0 ||
                      (((NAN(fVar79) || (local_148.l.vz.field_0.m128[2] != 0.0)) ||
                       (NAN(local_148.l.vz.field_0.m128[2]))))))) {
                    poVar64 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar64);
                    uVar71 = extraout_RDX_22;
                  }
                  fVar79 = local_88 * local_148.p.field_0.m128[0] +
                           local_108 * local_148.p.field_0.m128[1] +
                           local_f8 * local_148.p.field_0.m128[2];
                  fVar100 = fStack_84 * local_148.p.field_0.m128[0] +
                            fStack_104 * local_148.p.field_0.m128[1] +
                            fStack_f4 * local_148.p.field_0.m128[2];
                  fVar101 = fStack_80 * local_148.p.field_0.m128[0] +
                            fStack_100 * local_148.p.field_0.m128[1] +
                            fStack_f0 * local_148.p.field_0.m128[2];
                  local_148.l.vy.field_0._8_1_ = 1;
                  fVar104 = (float)local_e8._0_4_;
                  fVar122 = (float)local_b8._0_4_;
                  fVar94 = (float)local_98._0_4_;
                  fVar106 = (float)local_98._4_4_;
                  fVar112 = fStack_90;
                  fVar105 = (float)local_d8._0_4_;
                  uVar62 = local_148.l.vz.field_0.m128[0];
                  uVar117 = local_148.l.vz.field_0.m128[1];
                  fVar127 = fStack_c0;
                  fVar110 = (float)local_a8._0_4_;
                }
                else {
                  if (((local_178 != 0.0) || (NAN(local_178))) ||
                     ((fVar81 != 0.0 ||
                      ((NAN(fVar81) ||
                       (uVar66 = *(undefined8 *)((long)pAVar14 + lVar74 + -0x10),
                       auVar30._4_4_ = -(uint)(*(float *)((long)pAVar14 + lVar74 + -0x20) != 0.0),
                       auVar30._0_4_ = -(uint)(*(float *)((long)pAVar14 + lVar74 + -0x18) != 0.0),
                       auVar30._8_4_ = -(uint)((float)uVar66 != 0.0),
                       auVar30._12_4_ = -(uint)((float)((ulong)uVar66 >> 0x20) != 0.0),
                       uVar62 = movmskps((int)CONCAT71(uVar69,bVar61),auVar30), (char)uVar62 != '\0'
                       )))))) {
                    poVar64 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar64);
                    uVar71 = extraout_RDX_21;
                  }
                  pfVar2 = (float *)(lVar15 + -0x30 + lVar74);
                  pfVar3 = (float *)(lVar15 + -0x20 + lVar74);
                  pfVar4 = (float *)(lVar15 + -0x10 + lVar74);
                  fVar79 = *pfVar4;
                  fVar100 = pfVar4[1];
                  pfVar1 = (float *)(lVar15 + lVar74);
                  uVar66 = *(undefined8 *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                  fVar80 = *(float *)((long)pAVar14 + lVar74 + -0x30) * *pfVar2;
                  local_178 = pfVar2[1] + (float)uVar66;
                  fVar81 = pfVar2[2] + (float)((ulong)uVar66 >> 0x20);
                  fVar101 = pfVar4[2] * *(float *)((long)pAVar14 + lVar74 + -8);
                  local_148.l.vy.field_0._8_1_ = 1;
                  fVar104 = pfVar4[3];
                  fVar122 = pfVar2[3];
                  fVar94 = *pfVar1;
                  fVar106 = pfVar1[1];
                  fVar112 = pfVar1[2];
                  fVar105 = pfVar1[3];
                  uVar62 = *pfVar3;
                  uVar117 = pfVar3[1] * *(float *)((long)pAVar14 + lVar74 + -0x1c);
                  fVar127 = pfVar3[2] + *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 8);
                  fVar110 = pfVar3[3];
                }
              }
            }
          }
          else {
            pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x24);
            auVar27._4_4_ = -(uint)(pfVar1[1] != 0.0);
            auVar27._0_4_ = -(uint)(*pfVar1 != 0.0);
            auVar27._8_4_ = -(uint)(pfVar1[2] != 1.0);
            auVar27._12_4_ = -(uint)(pfVar1[3] != 0.0);
            uVar75 = movmskps(uVar75,auVar27);
            if ((((bVar11 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
               (((uVar75 & 4) != 0 ||
                (bVar70 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70),
                bVar70 != 0)))) goto LAB_00154fa6;
            pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x14);
            auVar28._4_4_ = -(uint)(pfVar1[1] != 0.0);
            auVar28._0_4_ = -(uint)(*pfVar1 != 0.0);
            auVar28._8_4_ = -(uint)(pfVar1[2] != 0.0);
            auVar28._12_4_ = -(uint)(pfVar1[3] != 1.0);
            uVar75 = movmskps(uVar75,auVar28);
            if (((((bVar11 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0)) ||
               (bVar70 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70),
               bVar70 != 0)) goto LAB_00154fa6;
            pfVar1 = (float *)((long)pAVar14 + lVar74 + -4);
            auVar29._4_4_ = -(uint)(pfVar1[1] != 0.0);
            auVar29._0_4_ = -(uint)(*pfVar1 != 0.0);
            auVar29._8_4_ = -(uint)(pfVar1[2] != 0.0);
            auVar29._12_4_ = -(uint)(pfVar1[3] != 0.0);
            uVar75 = movmskps(uVar75,auVar29);
            if ((((bVar11 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0))
            goto LAB_00154fa6;
            bVar70 = ((byte)uVar75 & 8) >> 3;
            uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
            uVar71 = (ulong)uVar75;
            if ((bVar70 != 0) ||
               ((bVar11 != false &&
                ((fVar79 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 0xc), fVar79 != 1.0
                 || (NAN(fVar79))))))) goto LAB_00154fa6;
            pfVar1 = (float *)(lVar15 + -0x30 + lVar74);
            fVar80 = *pfVar1;
            local_178 = pfVar1[1];
            fVar81 = pfVar1[2];
            fVar122 = pfVar1[3];
            pfVar1 = (float *)(lVar15 + -0x20 + lVar74);
            uVar62 = *pfVar1;
            uVar117 = pfVar1[1];
            fVar127 = pfVar1[2];
            fVar110 = pfVar1[3];
            pfVar1 = (float *)(lVar15 + -0x10 + lVar74);
            fVar79 = *pfVar1;
            fVar100 = pfVar1[1];
            fVar101 = pfVar1[2];
            fVar104 = pfVar1[3];
            pfVar1 = (float *)(lVar15 + lVar74);
            fVar94 = *pfVar1;
            fVar106 = pfVar1[1];
            fVar112 = pfVar1[2];
            fVar105 = pfVar1[3];
            local_148.l.vy.field_0._8_1_ = bVar61;
          }
LAB_001556d7:
          pfVar1 = (float *)(local_148.l.vy.field_0._0_8_ + -0x30 + lVar74);
          *pfVar1 = fVar80;
          pfVar1[1] = local_178;
          pfVar1[2] = fVar81;
          pfVar1[3] = fVar122;
          pfVar1 = (float *)(local_148.l.vy.field_0._0_8_ + -0x20 + lVar74);
          *pfVar1 = (float)uVar62;
          pfVar1[1] = (float)uVar117;
          pfVar1[2] = fVar127;
          pfVar1[3] = fVar110;
          pfVar1 = (float *)(local_148.l.vy.field_0._0_8_ + -0x10 + lVar74);
          *pfVar1 = fVar79;
          pfVar1[1] = fVar100;
          pfVar1[2] = fVar101;
          pfVar1[3] = fVar104;
          pfVar1 = (float *)(local_148.l.vy.field_0._0_8_ + lVar74);
          *pfVar1 = fVar94;
          pfVar1[1] = fVar106;
          pfVar1[2] = fVar112;
          pfVar1[3] = fVar105;
          lVar74 = lVar74 + 0x40;
          uVar66 = local_148.l.vy.field_0._0_8_;
        }
      }
      convertInstances(local_68,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)local_70,(Ref<embree::SceneGraph::Node> *)(plVar63 + 0x13),
                       (Transformations *)local_158);
      SceneGraph::Transformations::~Transformations((Transformations *)local_158);
      (**(code **)(*plVar63 + 0x18))(plVar63);
    }
  }
  return;
}

Assistant:

void convertInstances(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node, const SceneGraph::Transformations& spaces)
    {
      if (node->isClosed()) {
        //if (group.size() % 10000 == 0) std::cout << "." << std::flush;
        group.push_back(new SceneGraph::TransformNode(spaces,lookupGeometries(node)));
      }
      else if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
        convertInstances(group,xfmNode->child, spaces*xfmNode->spaces);
      }
      else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
        convertInstances(group,xfmNode->child, spaces*xfmNode->spaces);
      }
      else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertInstances(group,child,spaces);
      }
    }